

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_horizontal_14_sse2
               (uint16_t *s,int pitch,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined8 *puVar39;
  undefined4 uVar40;
  uint *puVar41;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  long in_RDI;
  uint8_t *in_R8;
  uint in_R9D;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int i;
  __m128i pq [7];
  __m128i q [7];
  __m128i p [7];
  int flat2_mask;
  __m128i sum_q;
  __m128i sum_lq;
  __m128i sum_lp;
  __m128i sum_p;
  __m128i sum_p_0;
  __m128i work0_1;
  __m128i work0_0;
  __m128i work0;
  __m128i four;
  __m128i eight;
  __m128i sum_p3;
  __m128i sum_p6;
  __m128i flat2_pq [6];
  __m128i flat2_q [6];
  __m128i flat2_p [6];
  __m128i flat_pq [3];
  __m128i flat_q [3];
  __m128i flat_p [3];
  __m128i flat2;
  __m128i flat;
  __m128i qs0qs1;
  __m128i ps0ps1;
  __m128i abs_p1p0;
  __m128i q1q0;
  __m128i p1p0;
  __m128i hevhev;
  __m128i mask;
  __m128i t80;
  __m128i thresh_1;
  __m128i limit_1;
  __m128i blimit_1;
  __m128i zero;
  int i_1;
  __m128i filter1filt;
  __m128i filter2filt;
  __m128i filter2filter1;
  __m128i filt;
  __m128i work;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i t3t4;
  __m128i pmin;
  __m128i pmax;
  __m128i one;
  __m128i zero_1;
  __m128i *q1q0_00;
  __m128i *p1p0_00;
  undefined4 in_stack_ffffffffffffe628;
  undefined2 in_stack_ffffffffffffe62c;
  undefined2 in_stack_ffffffffffffe62e;
  __m128i *l;
  __m128i *abs_p1p0_00;
  __m128i *palVar47;
  __m128i *palVar48;
  int iVar49;
  __m128i *in_stack_ffffffffffffe658;
  undefined8 auStack_19a0 [13];
  undefined8 local_1938 [28];
  uint local_1854;
  int local_1834;
  long local_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined8 *local_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 *local_17f8;
  uint local_17ec;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  short local_17c8;
  short sStack_17c6;
  short sStack_17c4;
  short sStack_17c2;
  short sStack_17c0;
  short sStack_17be;
  short sStack_17bc;
  short sStack_17ba;
  short local_17b8;
  short sStack_17b6;
  short sStack_17b4;
  short sStack_17b2;
  short sStack_17b0;
  short sStack_17ae;
  short sStack_17ac;
  short sStack_17aa;
  short local_17a8;
  short sStack_17a6;
  short sStack_17a4;
  short sStack_17a2;
  short sStack_17a0;
  short sStack_179e;
  short sStack_179c;
  short sStack_179a;
  short local_1798;
  short sStack_1796;
  short sStack_1794;
  short sStack_1792;
  short sStack_1790;
  short sStack_178e;
  short sStack_178c;
  short sStack_178a;
  short local_1788;
  short sStack_1786;
  short sStack_1784;
  short sStack_1782;
  short sStack_1780;
  short sStack_177e;
  short sStack_177c;
  short sStack_177a;
  short local_1778;
  short sStack_1776;
  short sStack_1774;
  short sStack_1772;
  short sStack_1770;
  short sStack_176e;
  short sStack_176c;
  short sStack_176a;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  short local_1748;
  short sStack_1746;
  short sStack_1744;
  short sStack_1742;
  short sStack_1740;
  short sStack_173e;
  short sStack_173c;
  short sStack_173a;
  short local_1738;
  short sStack_1736;
  short sStack_1734;
  short sStack_1732;
  short sStack_1730;
  short sStack_172e;
  short sStack_172c;
  short sStack_172a;
  undefined8 local_1728;
  undefined8 uStack_1720;
  ushort local_1718;
  ushort uStack_1716;
  ushort uStack_1714;
  ushort uStack_1712;
  ushort uStack_1710;
  ushort uStack_170e;
  ushort uStack_170c;
  ushort uStack_170a;
  ushort local_1708;
  ushort uStack_1706;
  ushort uStack_1704;
  ushort uStack_1702;
  ushort uStack_1700;
  ushort uStack_16fe;
  ushort uStack_16fc;
  ushort uStack_16fa;
  ushort local_16f8;
  ushort uStack_16f6;
  ushort uStack_16f4;
  ushort uStack_16f2;
  ushort uStack_16f0;
  ushort uStack_16ee;
  ushort uStack_16ec;
  ushort uStack_16ea;
  ushort local_16e8;
  ushort uStack_16e6;
  ushort uStack_16e4;
  ushort uStack_16e2;
  ushort uStack_16e0;
  ushort uStack_16de;
  ushort uStack_16dc;
  ushort uStack_16da;
  ushort local_16d8;
  ushort uStack_16d6;
  ushort uStack_16d4;
  ushort uStack_16d2;
  ushort uStack_16d0;
  ushort uStack_16ce;
  ushort uStack_16cc;
  ushort uStack_16ca;
  ushort local_16c8;
  ushort uStack_16c6;
  ushort uStack_16c4;
  ushort uStack_16c2;
  short sStack_16c0;
  short sStack_16be;
  short sStack_16bc;
  short sStack_16ba;
  ushort local_16b8;
  ushort uStack_16b6;
  ushort uStack_16b4;
  ushort uStack_16b2;
  short sStack_16b0;
  short sStack_16ae;
  short sStack_16ac;
  short sStack_16aa;
  ushort local_16a8;
  ushort uStack_16a6;
  ushort uStack_16a4;
  ushort uStack_16a2;
  short sStack_16a0;
  short sStack_169e;
  short sStack_169c;
  short sStack_169a;
  ushort local_1698;
  ushort uStack_1696;
  ushort uStack_1694;
  ushort uStack_1692;
  short sStack_1690;
  short sStack_168e;
  short sStack_168c;
  short sStack_168a;
  ushort local_1688;
  ushort uStack_1686;
  ushort uStack_1684;
  ushort uStack_1682;
  short sStack_1680;
  short sStack_167e;
  short sStack_167c;
  short sStack_167a;
  ushort local_1678;
  ushort uStack_1676;
  ushort uStack_1674;
  ushort uStack_1672;
  short sStack_1670;
  short sStack_166e;
  short sStack_166c;
  short sStack_166a;
  ushort local_1668;
  ushort uStack_1666;
  ushort uStack_1664;
  ushort uStack_1662;
  short sStack_1660;
  short sStack_165e;
  short sStack_165c;
  short sStack_165a;
  ushort local_1658;
  ushort uStack_1656;
  ushort uStack_1654;
  ushort uStack_1652;
  short sStack_1650;
  short sStack_164e;
  short sStack_164c;
  short sStack_164a;
  ushort local_1648;
  ushort uStack_1646;
  ushort uStack_1644;
  ushort uStack_1642;
  short sStack_1640;
  short sStack_163e;
  short sStack_163c;
  short sStack_163a;
  ushort local_1638;
  ushort uStack_1636;
  ushort uStack_1634;
  ushort uStack_1632;
  short sStack_1630;
  short sStack_162e;
  short sStack_162c;
  short sStack_162a;
  ushort local_1628;
  ushort uStack_1626;
  ushort uStack_1624;
  ushort uStack_1622;
  short sStack_1620;
  short sStack_161e;
  short sStack_161c;
  short sStack_161a;
  ushort local_1618;
  ushort uStack_1616;
  ushort uStack_1614;
  ushort uStack_1612;
  short sStack_1610;
  short sStack_160e;
  short sStack_160c;
  short sStack_160a;
  undefined8 local_1608;
  undefined8 uStack_1600;
  ushort local_15f8;
  ushort uStack_15f6;
  ushort uStack_15f4;
  ushort uStack_15f2;
  ushort uStack_15f0;
  ushort uStack_15ee;
  ushort uStack_15ec;
  ushort uStack_15ea;
  ushort local_15e8;
  ushort uStack_15e6;
  ushort uStack_15e4;
  ushort uStack_15e2;
  ushort uStack_15e0;
  ushort uStack_15de;
  ushort uStack_15dc;
  ushort uStack_15da;
  ushort local_15d8;
  ushort uStack_15d6;
  ushort uStack_15d4;
  ushort uStack_15d2;
  short sStack_15d0;
  short sStack_15ce;
  short sStack_15cc;
  short sStack_15ca;
  ushort local_15c8;
  ushort uStack_15c6;
  ushort uStack_15c4;
  ushort uStack_15c2;
  short sStack_15c0;
  short sStack_15be;
  short sStack_15bc;
  short sStack_15ba;
  ushort local_15b8;
  ushort uStack_15b6;
  ushort uStack_15b4;
  ushort uStack_15b2;
  short sStack_15b0;
  short sStack_15ae;
  short sStack_15ac;
  short sStack_15aa;
  ushort local_15a8;
  ushort uStack_15a6;
  ushort uStack_15a4;
  ushort uStack_15a2;
  short sStack_15a0;
  short sStack_159e;
  short sStack_159c;
  short sStack_159a;
  ushort local_1598;
  ushort uStack_1596;
  ushort uStack_1594;
  ushort uStack_1592;
  short sStack_1590;
  short sStack_158e;
  short sStack_158c;
  short sStack_158a;
  ushort local_1588;
  ushort uStack_1586;
  ushort uStack_1584;
  ushort uStack_1582;
  short sStack_1580;
  short sStack_157e;
  short sStack_157c;
  short sStack_157a;
  ulong local_1578;
  ulong uStack_1570;
  ulong local_1568;
  ulong uStack_1560;
  undefined8 local_1558;
  undefined4 uStack_154c;
  undefined4 local_1548;
  undefined4 uStack_1544;
  undefined4 uStack_153c;
  longlong local_1528;
  __m128i *in_stack_ffffffffffffeae0;
  __m128i *in_stack_ffffffffffffeae8;
  __m128i *in_stack_ffffffffffffeaf0;
  __m128i *in_stack_ffffffffffffeaf8;
  ulong local_14f8;
  ulong uStack_14f0;
  longlong local_14e8;
  longlong lStack_14e0;
  longlong local_14d8 [2];
  longlong local_14c8 [2];
  longlong local_14b8 [2];
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  int local_1490;
  uint local_148c;
  undefined8 *local_1470;
  undefined8 *local_1468;
  undefined8 *local_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 *local_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 *local_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  ulong local_1288;
  ulong uStack_1280;
  ulong local_1278;
  ulong uStack_1270;
  ulong local_1268;
  ulong uStack_1260;
  ulong local_1258;
  ulong uStack_1250;
  undefined8 local_1248;
  ulong uStack_1240;
  undefined8 local_1238;
  undefined4 uStack_1230;
  undefined4 uStack_122c;
  undefined1 local_1228 [16];
  undefined1 local_1218 [16];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  uint local_1184;
  longlong *local_1180;
  undefined4 *local_1178;
  undefined8 *local_1170;
  __m128i *local_1168;
  __m128i *local_1160;
  __m128i *local_1158;
  __m128i *local_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  ulong local_1138;
  ulong uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  ulong local_10f8;
  ulong uStack_10f0;
  ulong local_10e8;
  ulong uStack_10e0;
  ulong local_10d8;
  ulong uStack_10d0;
  ulong local_10c8;
  ulong uStack_10c0;
  ulong local_10b8;
  longlong lStack_10b0;
  ulong local_10a8;
  undefined8 uStack_10a0;
  ulong local_1098;
  ulong uStack_1090;
  ulong local_1088;
  ulong uStack_1080;
  ulong local_1078;
  ulong uStack_1070;
  ulong local_1068;
  ulong uStack_1060;
  ulong local_1058;
  ulong uStack_1050;
  ulong local_1048;
  ulong uStack_1040;
  ulong local_1038;
  ulong uStack_1030;
  ulong local_1028;
  ulong uStack_1020;
  short local_1018;
  short sStack_1016;
  short sStack_1014;
  short sStack_1012;
  short sStack_1010;
  short sStack_100e;
  short sStack_100c;
  ushort uStack_100a;
  short local_1008;
  short sStack_1006;
  short sStack_1004;
  short sStack_1002;
  short sStack_1000;
  short sStack_ffe;
  short sStack_ffc;
  ushort uStack_ffa;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  ulong uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  ulong uStack_fc0;
  undefined2 local_fae;
  undefined2 local_fac;
  undefined2 local_faa;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  short local_f68;
  short sStack_f66;
  short sStack_f64;
  short sStack_f62;
  short sStack_f60;
  short sStack_f5e;
  short sStack_f5c;
  short sStack_f5a;
  undefined8 local_f58;
  undefined8 uStack_f50;
  short local_f48;
  short sStack_f46;
  short sStack_f44;
  short sStack_f42;
  short sStack_f40;
  short sStack_f3e;
  short sStack_f3c;
  short sStack_f3a;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  short local_ea8;
  short sStack_ea6;
  short sStack_ea4;
  short sStack_ea2;
  short sStack_ea0;
  short sStack_e9e;
  short sStack_e9c;
  short sStack_e9a;
  undefined8 local_e98;
  undefined8 uStack_e90;
  short local_e88;
  short sStack_e86;
  short sStack_e84;
  short sStack_e82;
  short sStack_e80;
  short sStack_e7e;
  short sStack_e7c;
  short sStack_e7a;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  short local_de8;
  short sStack_de6;
  short sStack_de4;
  short sStack_de2;
  short sStack_de0;
  short sStack_dde;
  short sStack_ddc;
  short sStack_dda;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  short local_dc8;
  short sStack_dc6;
  short sStack_dc4;
  short sStack_dc2;
  short sStack_dc0;
  short sStack_dbe;
  short sStack_dbc;
  short sStack_dba;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  short local_d28;
  short sStack_d26;
  short sStack_d24;
  short sStack_d22;
  short sStack_d20;
  short sStack_d1e;
  short sStack_d1c;
  short sStack_d1a;
  undefined8 local_d18;
  undefined8 uStack_d10;
  short local_d08;
  short sStack_d06;
  short sStack_d04;
  short sStack_d02;
  short sStack_d00;
  short sStack_cfe;
  short sStack_cfc;
  short sStack_cfa;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  short local_c68;
  short sStack_c66;
  short sStack_c64;
  short sStack_c62;
  short sStack_c60;
  short sStack_c5e;
  short sStack_c5c;
  short sStack_c5a;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  short local_c28;
  short sStack_c26;
  short sStack_c24;
  short sStack_c22;
  short sStack_c20;
  short sStack_c1e;
  short sStack_c1c;
  short sStack_c1a;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  short local_b08;
  short sStack_b06;
  short sStack_b04;
  short sStack_b02;
  short sStack_b00;
  short sStack_afe;
  short sStack_afc;
  short sStack_afa;
  undefined8 local_af8;
  undefined8 uStack_af0;
  short local_ae8;
  short sStack_ae6;
  short sStack_ae4;
  short sStack_ae2;
  short sStack_ae0;
  short sStack_ade;
  short sStack_adc;
  short sStack_ada;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  short local_a98;
  short sStack_a96;
  short sStack_a94;
  short sStack_a92;
  short sStack_a90;
  short sStack_a8e;
  short sStack_a8c;
  short sStack_a8a;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  short local_a28;
  short sStack_a26;
  short sStack_a24;
  short sStack_a22;
  short sStack_a20;
  short sStack_a1e;
  short sStack_a1c;
  short sStack_a1a;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  short local_9e8;
  short sStack_9e6;
  short sStack_9e4;
  short sStack_9e2;
  short sStack_9e0;
  short sStack_9de;
  short sStack_9dc;
  short sStack_9da;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  short local_9a8;
  short sStack_9a6;
  short sStack_9a4;
  short sStack_9a2;
  short sStack_9a0;
  short sStack_99e;
  short sStack_99c;
  short sStack_99a;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  short local_968;
  short sStack_966;
  short sStack_964;
  short sStack_962;
  short sStack_960;
  short sStack_95e;
  short sStack_95c;
  short sStack_95a;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  short local_908;
  short sStack_906;
  short sStack_904;
  short sStack_902;
  short sStack_900;
  short sStack_8fe;
  short sStack_8fc;
  short sStack_8fa;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  short local_8c8;
  short sStack_8c6;
  short sStack_8c4;
  short sStack_8c2;
  short local_8b8;
  short sStack_8b6;
  short sStack_8b4;
  short sStack_8b2;
  short sStack_8b0;
  short sStack_8ae;
  short sStack_8ac;
  short sStack_8aa;
  short local_8a8;
  short sStack_8a6;
  short sStack_8a4;
  short sStack_8a2;
  short sStack_8a0;
  short sStack_89e;
  short sStack_89c;
  short sStack_89a;
  short local_898;
  short sStack_896;
  short sStack_894;
  short sStack_892;
  short sStack_890;
  short sStack_88e;
  short sStack_88c;
  short sStack_88a;
  short local_888;
  short sStack_886;
  short sStack_884;
  short sStack_882;
  short sStack_880;
  short sStack_87e;
  short sStack_87c;
  short sStack_87a;
  short local_868;
  short sStack_866;
  short sStack_864;
  short sStack_862;
  short sStack_860;
  short sStack_85e;
  short sStack_85c;
  short sStack_85a;
  short local_848;
  short sStack_846;
  short sStack_844;
  short sStack_842;
  short sStack_840;
  short sStack_83e;
  short sStack_83c;
  short sStack_83a;
  short local_828;
  short sStack_826;
  short sStack_824;
  short sStack_822;
  short sStack_820;
  short sStack_81e;
  short sStack_81c;
  short sStack_81a;
  short local_808;
  short sStack_806;
  short sStack_804;
  short sStack_802;
  short sStack_800;
  short sStack_7fe;
  short sStack_7fc;
  short sStack_7fa;
  short local_7e8;
  short sStack_7e6;
  short sStack_7e4;
  short sStack_7e2;
  short sStack_7e0;
  short sStack_7de;
  short sStack_7dc;
  short sStack_7da;
  short local_7c8;
  short sStack_7c6;
  short sStack_7c4;
  short sStack_7c2;
  short sStack_7c0;
  short sStack_7be;
  short sStack_7bc;
  short sStack_7ba;
  short local_7a8;
  short sStack_7a6;
  short sStack_7a4;
  short sStack_7a2;
  short sStack_7a0;
  short sStack_79e;
  short sStack_79c;
  short sStack_79a;
  short local_788;
  short sStack_786;
  short sStack_784;
  short sStack_782;
  short sStack_780;
  short sStack_77e;
  short sStack_77c;
  short sStack_77a;
  short local_768;
  short sStack_766;
  short sStack_764;
  short sStack_762;
  short sStack_760;
  short sStack_75e;
  short sStack_75c;
  short sStack_75a;
  short local_748;
  short sStack_746;
  short sStack_744;
  short sStack_742;
  short sStack_740;
  short sStack_73e;
  short sStack_73c;
  short sStack_73a;
  short local_728;
  short sStack_726;
  short sStack_724;
  short sStack_722;
  short sStack_720;
  short sStack_71e;
  short sStack_71c;
  short sStack_71a;
  short local_708;
  short sStack_706;
  short sStack_704;
  short sStack_702;
  short sStack_700;
  short sStack_6fe;
  short sStack_6fc;
  short sStack_6fa;
  short local_6e8;
  short sStack_6e6;
  short sStack_6e4;
  short sStack_6e2;
  short sStack_6e0;
  short sStack_6de;
  short sStack_6dc;
  short sStack_6da;
  ulong local_5a8;
  undefined4 uStack_5a0;
  undefined4 uStack_59c;
  undefined4 local_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 local_588;
  undefined4 uStack_584;
  undefined4 uStack_580;
  undefined4 uStack_570;
  undefined4 uStack_560;
  undefined4 uStack_550;
  ulong local_548;
  ulong uStack_540;
  ulong local_538;
  ulong uStack_530;
  uint local_528;
  uint uStack_524;
  uint uStack_520;
  uint uStack_51c;
  uint local_518;
  uint uStack_514;
  uint uStack_510;
  uint uStack_50c;
  uint local_508;
  uint uStack_504;
  uint uStack_500;
  uint uStack_4fc;
  uint local_4f8;
  uint uStack_4f4;
  uint uStack_4f0;
  uint uStack_4ec;
  uint local_49c;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  ulong uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  ulong uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  ulong uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  ulong uStack_420;
  ulong local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  longlong local_3d8;
  longlong lStack_3d0;
  longlong local_3b8;
  longlong lStack_3b0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined1 local_378 [16];
  undefined8 local_368;
  undefined8 uStack_360;
  undefined1 local_358 [16];
  undefined8 local_308;
  undefined8 uStack_300;
  undefined2 local_2f8;
  undefined2 local_2f6;
  undefined2 local_2f4;
  undefined2 local_2f2;
  undefined2 local_2f0;
  undefined2 local_2ee;
  undefined2 local_2ec;
  undefined2 local_2ea;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined2 local_2d0;
  undefined2 local_2ce;
  undefined2 local_2cc;
  undefined2 local_2ca;
  undefined2 local_2c8;
  undefined2 local_2c6;
  undefined2 local_2c4;
  undefined2 local_2c2;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ulong local_f8;
  ulong uStack_f0;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_1854 = in_R9D;
  for (iVar49 = 0; iVar49 < 7; iVar49 = iVar49 + 1) {
    local_17f8 = (undefined8 *)(in_RDI + (long)((iVar49 + 1) * in_ESI) * -2);
    local_1808 = *local_17f8;
    uStack_1800 = 0;
    local_1938[(long)iVar49 * 2 + 0xe] = local_1808;
    local_1938[(long)iVar49 * 2 + 0xf] = 0;
    local_1810 = (undefined8 *)(in_RDI + (long)(iVar49 * in_ESI) * 2);
    local_1828 = *local_1810;
    uStack_1820 = 0;
    local_1938[(long)iVar49 * 2] = local_1828;
    local_1938[(long)iVar49 * 2 + 1] = 0;
  }
  local_1460 = local_1938 + 0xe;
  local_1468 = local_1938;
  local_1470 = (undefined8 *)&stack0xffffffffffffe658;
  local_148c = local_1854;
  local_1418 = 0;
  uStack_1410 = 0;
  local_14a8 = 0;
  uStack_14a0 = 0;
  local_1834 = in_ESI;
  local_1830 = in_RDI;
  get_limit(in_RDX,in_RCX,in_R8,local_1854,&local_14b8,&local_14c8,&local_14d8,
            (__m128i *)&local_14e8);
  for (local_1490 = 0; local_1490 < 7; local_1490 = local_1490 + 1) {
    uVar1 = local_1460[(long)local_1490 * 2];
    uVar2 = (local_1460 + (long)local_1490 * 2)[1];
    uVar3 = local_1468[(long)local_1490 * 2];
    uVar4 = (local_1468 + (long)local_1490 * 2)[1];
    local_1470[(long)local_1490 * 2] = uVar1;
    (local_1470 + (long)local_1490 * 2)[1] = uVar3;
    local_1408 = uVar3;
    uStack_1400 = uVar4;
    local_13f8 = uVar1;
    uStack_13f0 = uVar2;
  }
  p1p0_00 = (__m128i *)&local_14f8;
  q1q0_00 = (__m128i *)&stack0xffffffffffffeaf8;
  l = (__m128i *)&stack0xffffffffffffeae8;
  abs_p1p0_00 = (__m128i *)&local_1528;
  palVar47 = q1q0_00;
  palVar48 = p1p0_00;
  highbd_hev_filter_mask_x_sse2
            (in_stack_ffffffffffffe658,iVar49,p1p0_00,q1q0_00,abs_p1p0_00,l,
             in_stack_ffffffffffffeae0,in_stack_ffffffffffffeae8,in_stack_ffffffffffffeaf0,
             in_stack_ffffffffffffeaf8);
  local_1170 = &local_1558;
  local_1178 = &local_1548;
  local_1180 = &local_14e8;
  local_1184 = local_148c;
  local_1148 = 0;
  uStack_1140 = 0;
  local_1198 = 0;
  uStack_1190 = 0;
  local_fae = 1;
  local_2ea = 1;
  local_2ec = 1;
  local_2ee = 1;
  local_2f0 = 1;
  local_2f2 = 1;
  local_2f4 = 1;
  local_2f6 = 1;
  local_2f8 = 1;
  local_11a8 = 0x1000100010001;
  uStack_11a0 = 0x1000100010001;
  local_49c = local_148c;
  auVar42._8_8_ = 0x1000100010001;
  auVar42._0_8_ = 0x1000100010001;
  local_358 = psllw(auVar42,ZEXT416(local_148c));
  auVar43._8_8_ = 0x1000100010001;
  auVar43._0_8_ = 0x1000100010001;
  local_378 = psubsw(local_358,auVar43);
  auVar33._8_8_ = lStack_14e0;
  auVar33._0_8_ = local_14e8;
  local_11b8 = psubsw(local_378,auVar33);
  auVar34._8_8_ = lStack_14e0;
  auVar34._0_8_ = local_14e8;
  local_398 = 0;
  uStack_390 = 0;
  auVar42 = psubsw(ZEXT816(0),auVar34);
  local_2c2 = 3;
  local_2c4 = 3;
  local_2c6 = 3;
  local_2c8 = 3;
  local_2ca = 4;
  local_2cc = 4;
  local_2ce = 4;
  local_2d0 = 4;
  local_11d8 = 0x4000400040004;
  uStack_11d0 = 0x3000300030003;
  local_3b8 = (*l)[0];
  lStack_3b0 = (*l)[1];
  auVar35._8_8_ = lStack_14e0;
  auVar35._0_8_ = local_14e8;
  auVar43 = psubsw((undefined1  [16])*l,auVar35);
  local_3d8 = (*abs_p1p0_00)[0];
  lStack_3d0 = (*abs_p1p0_00)[1];
  auVar36._8_8_ = lStack_14e0;
  auVar36._0_8_ = local_14e8;
  auVar44 = psubsw((undefined1  [16])*abs_p1p0_00,auVar36);
  local_11e8._0_8_ = auVar43._0_8_;
  local_11e8._8_8_ = auVar43._8_8_;
  local_11f8._0_8_ = auVar44._0_8_;
  local_11f8._8_8_ = auVar44._8_8_;
  local_3f8 = local_11e8._0_8_;
  uStack_3f0 = local_11e8._8_8_;
  local_408 = local_11f8._0_8_;
  uStack_400 = local_11f8._8_8_;
  local_1208 = psubsw(auVar43,auVar44);
  local_2b0 = local_11c8;
  local_2b8 = local_11b8;
  local_1c0 = local_1208;
  uVar1 = local_1208._0_8_;
  uVar2 = local_1208._8_8_;
  local_98._0_2_ = local_1208._0_2_;
  local_98._2_2_ = local_1208._2_2_;
  local_98._4_2_ = local_1208._4_2_;
  local_98._6_2_ = local_1208._6_2_;
  uStack_90._0_2_ = local_1208._8_2_;
  uStack_90._2_2_ = local_1208._10_2_;
  uStack_90._4_2_ = local_1208._12_2_;
  uStack_90._6_2_ = local_1208._14_2_;
  local_a8._0_2_ = local_11b8._0_2_;
  local_a8._2_2_ = local_11b8._2_2_;
  local_a8._4_2_ = local_11b8._4_2_;
  local_a8._6_2_ = local_11b8._6_2_;
  uStack_a0._0_2_ = local_11b8._8_2_;
  uStack_a0._2_2_ = local_11b8._10_2_;
  uStack_a0._4_2_ = local_11b8._12_2_;
  uStack_a0._6_2_ = local_11b8._14_2_;
  local_1208._0_2_ =
       (ushort)((short)local_a8 < (short)local_98) * (short)local_a8 |
       (ushort)((short)local_a8 >= (short)local_98) * (short)local_98;
  local_1208._2_2_ =
       (ushort)(local_a8._2_2_ < local_98._2_2_) * local_a8._2_2_ |
       (ushort)(local_a8._2_2_ >= local_98._2_2_) * local_98._2_2_;
  local_1208._4_2_ =
       (ushort)(local_a8._4_2_ < local_98._4_2_) * local_a8._4_2_ |
       (ushort)(local_a8._4_2_ >= local_98._4_2_) * local_98._4_2_;
  local_1208._6_2_ =
       (ushort)(local_a8._6_2_ < local_98._6_2_) * local_a8._6_2_ |
       (ushort)(local_a8._6_2_ >= local_98._6_2_) * local_98._6_2_;
  local_1208._8_2_ =
       (ushort)((short)uStack_a0 < (short)uStack_90) * (short)uStack_a0 |
       (ushort)((short)uStack_a0 >= (short)uStack_90) * (short)uStack_90;
  local_1208._10_2_ =
       (ushort)(uStack_a0._2_2_ < uStack_90._2_2_) * uStack_a0._2_2_ |
       (ushort)(uStack_a0._2_2_ >= uStack_90._2_2_) * uStack_90._2_2_;
  local_1208._12_2_ =
       (ushort)(uStack_a0._4_2_ < uStack_90._4_2_) * uStack_a0._4_2_ |
       (ushort)(uStack_a0._4_2_ >= uStack_90._4_2_) * uStack_90._4_2_;
  local_1208._14_2_ =
       (ushort)(uStack_a0._6_2_ < uStack_90._6_2_) * uStack_a0._6_2_ |
       (ushort)(uStack_a0._6_2_ >= uStack_90._6_2_) * uStack_90._6_2_;
  uVar3 = local_1208._0_8_;
  uVar4 = local_1208._8_8_;
  uVar5 = local_11c8._0_8_;
  uVar6 = local_11c8._8_8_;
  local_198._0_2_ = local_1208._0_2_;
  local_198._2_2_ = local_1208._2_2_;
  local_198._4_2_ = local_1208._4_2_;
  local_198._6_2_ = local_1208._6_2_;
  uStack_190._0_2_ = local_1208._8_2_;
  uStack_190._2_2_ = local_1208._10_2_;
  uStack_190._4_2_ = local_1208._12_2_;
  uStack_190._6_2_ = local_1208._14_2_;
  local_1a8._0_2_ = local_11c8._0_2_;
  local_1a8._2_2_ = local_11c8._2_2_;
  local_1a8._4_2_ = local_11c8._4_2_;
  local_1a8._6_2_ = local_11c8._6_2_;
  uStack_1a0._0_2_ = local_11c8._8_2_;
  uStack_1a0._2_2_ = local_11c8._10_2_;
  uStack_1a0._4_2_ = local_11c8._12_2_;
  uStack_1a0._6_2_ = local_11c8._14_2_;
  local_1208._0_2_ =
       (ushort)((short)local_198 < (short)local_1a8) * (short)local_1a8 |
       (ushort)((short)local_198 >= (short)local_1a8) * (short)local_198;
  local_1208._2_2_ =
       (ushort)(local_198._2_2_ < local_1a8._2_2_) * local_1a8._2_2_ |
       (ushort)(local_198._2_2_ >= local_1a8._2_2_) * local_198._2_2_;
  local_1208._4_2_ =
       (ushort)(local_198._4_2_ < local_1a8._4_2_) * local_1a8._4_2_ |
       (ushort)(local_198._4_2_ >= local_1a8._4_2_) * local_198._4_2_;
  local_1208._6_2_ =
       (ushort)(local_198._6_2_ < local_1a8._6_2_) * local_1a8._6_2_ |
       (ushort)(local_198._6_2_ >= local_1a8._6_2_) * local_198._6_2_;
  local_1208._8_2_ =
       (ushort)((short)uStack_190 < (short)uStack_1a0) * (short)uStack_1a0 |
       (ushort)((short)uStack_190 >= (short)uStack_1a0) * (short)uStack_190;
  local_1208._10_2_ =
       (ushort)(uStack_190._2_2_ < uStack_1a0._2_2_) * uStack_1a0._2_2_ |
       (ushort)(uStack_190._2_2_ >= uStack_1a0._2_2_) * uStack_190._2_2_;
  local_1208._12_2_ =
       (ushort)(uStack_190._4_2_ < uStack_1a0._4_2_) * uStack_1a0._4_2_ |
       (ushort)(uStack_190._4_2_ >= uStack_1a0._4_2_) * uStack_190._4_2_;
  local_1208._14_2_ =
       (ushort)(uStack_190._6_2_ < uStack_1a0._6_2_) * uStack_1a0._6_2_ |
       (ushort)(uStack_190._6_2_ >= uStack_1a0._6_2_) * uStack_190._6_2_;
  local_10b8 = (*palVar47)[0];
  lStack_10b0 = (*palVar47)[1];
  local_10a8 = local_1208._8_8_;
  uStack_10a0 = 0;
  local_418 = local_1208._8_8_ & local_10b8;
  uStack_410 = 0;
  local_428 = local_1208._0_8_;
  uStack_420 = local_1208._8_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_418;
  auVar45 = psubsw(auVar28,local_1208);
  local_1218._0_8_ = auVar45._0_8_;
  local_1218._8_8_ = auVar45._8_8_;
  local_438 = local_1218._0_8_;
  uStack_430 = local_1218._8_8_;
  local_448 = local_1208._0_8_;
  uStack_440 = local_1208._8_8_;
  auVar45 = psubsw(auVar45,local_1208);
  local_1218._0_8_ = auVar45._0_8_;
  local_1218._8_8_ = auVar45._8_8_;
  local_458 = local_1218._0_8_;
  uStack_450 = local_1218._8_8_;
  local_468 = local_1208._0_8_;
  uStack_460 = local_1208._8_8_;
  local_1218 = psubsw(auVar45,local_1208);
  local_200 = local_1218;
  uVar7 = local_1218._0_8_;
  uVar8 = local_1218._8_8_;
  local_88 = local_11b8._0_8_;
  uStack_80 = local_11b8._8_8_;
  local_78._0_2_ = local_1218._0_2_;
  local_78._2_2_ = local_1218._2_2_;
  local_78._4_2_ = local_1218._4_2_;
  local_78._6_2_ = local_1218._6_2_;
  uStack_70._0_2_ = local_1218._8_2_;
  uStack_70._2_2_ = local_1218._10_2_;
  uStack_70._4_2_ = local_1218._12_2_;
  uStack_70._6_2_ = local_1218._14_2_;
  local_1218._0_2_ =
       (ushort)((short)local_a8 < (short)local_78) * (short)local_a8 |
       (ushort)((short)local_a8 >= (short)local_78) * (short)local_78;
  local_1218._2_2_ =
       (ushort)(local_a8._2_2_ < local_78._2_2_) * local_a8._2_2_ |
       (ushort)(local_a8._2_2_ >= local_78._2_2_) * local_78._2_2_;
  local_1218._4_2_ =
       (ushort)(local_a8._4_2_ < local_78._4_2_) * local_a8._4_2_ |
       (ushort)(local_a8._4_2_ >= local_78._4_2_) * local_78._4_2_;
  local_1218._6_2_ =
       (ushort)(local_a8._6_2_ < local_78._6_2_) * local_a8._6_2_ |
       (ushort)(local_a8._6_2_ >= local_78._6_2_) * local_78._6_2_;
  local_1218._8_2_ =
       (ushort)((short)uStack_a0 < (short)uStack_70) * (short)uStack_a0 |
       (ushort)((short)uStack_a0 >= (short)uStack_70) * (short)uStack_70;
  local_1218._10_2_ =
       (ushort)(uStack_a0._2_2_ < uStack_70._2_2_) * uStack_a0._2_2_ |
       (ushort)(uStack_a0._2_2_ >= uStack_70._2_2_) * uStack_70._2_2_;
  local_1218._12_2_ =
       (ushort)(uStack_a0._4_2_ < uStack_70._4_2_) * uStack_a0._4_2_ |
       (ushort)(uStack_a0._4_2_ >= uStack_70._4_2_) * uStack_70._4_2_;
  local_1218._14_2_ =
       (ushort)(uStack_a0._6_2_ < uStack_70._6_2_) * uStack_a0._6_2_ |
       (ushort)(uStack_a0._6_2_ >= uStack_70._6_2_) * uStack_70._6_2_;
  uVar9 = local_1218._0_8_;
  uVar10 = local_1218._8_8_;
  local_11c8._0_8_ = auVar42._0_8_;
  uVar11 = local_11c8._0_8_;
  local_11c8._8_8_ = auVar42._8_8_;
  uVar12 = local_11c8._8_8_;
  local_1d8._0_2_ = local_1218._0_2_;
  local_1d8._2_2_ = local_1218._2_2_;
  local_1d8._4_2_ = local_1218._4_2_;
  local_1d8._6_2_ = local_1218._6_2_;
  uStack_1d0._0_2_ = local_1218._8_2_;
  uStack_1d0._2_2_ = local_1218._10_2_;
  uStack_1d0._4_2_ = local_1218._12_2_;
  uStack_1d0._6_2_ = local_1218._14_2_;
  local_1e8._0_2_ = auVar42._0_2_;
  local_1e8._2_2_ = auVar42._2_2_;
  local_1e8._4_2_ = auVar42._4_2_;
  local_1e8._6_2_ = auVar42._6_2_;
  uStack_1e0._0_2_ = auVar42._8_2_;
  uStack_1e0._2_2_ = auVar42._10_2_;
  uStack_1e0._4_2_ = auVar42._12_2_;
  uStack_1e0._6_2_ = auVar42._14_2_;
  local_1218._0_2_ =
       (ushort)((short)local_1d8 < (short)local_1e8) * (short)local_1e8 |
       (ushort)((short)local_1d8 >= (short)local_1e8) * (short)local_1d8;
  local_1218._2_2_ =
       (ushort)(local_1d8._2_2_ < local_1e8._2_2_) * local_1e8._2_2_ |
       (ushort)(local_1d8._2_2_ >= local_1e8._2_2_) * local_1d8._2_2_;
  local_1218._4_2_ =
       (ushort)(local_1d8._4_2_ < local_1e8._4_2_) * local_1e8._4_2_ |
       (ushort)(local_1d8._4_2_ >= local_1e8._4_2_) * local_1d8._4_2_;
  local_1218._6_2_ =
       (ushort)(local_1d8._6_2_ < local_1e8._6_2_) * local_1e8._6_2_ |
       (ushort)(local_1d8._6_2_ >= local_1e8._6_2_) * local_1d8._6_2_;
  local_1218._8_2_ =
       (ushort)((short)uStack_1d0 < (short)uStack_1e0) * (short)uStack_1e0 |
       (ushort)((short)uStack_1d0 >= (short)uStack_1e0) * (short)uStack_1d0;
  local_1218._10_2_ =
       (ushort)(uStack_1d0._2_2_ < uStack_1e0._2_2_) * uStack_1e0._2_2_ |
       (ushort)(uStack_1d0._2_2_ >= uStack_1e0._2_2_) * uStack_1d0._2_2_;
  local_1218._12_2_ =
       (ushort)(uStack_1d0._4_2_ < uStack_1e0._4_2_) * uStack_1e0._4_2_ |
       (ushort)(uStack_1d0._4_2_ >= uStack_1e0._4_2_) * uStack_1d0._4_2_;
  local_1218._14_2_ =
       (ushort)(uStack_1d0._6_2_ < uStack_1e0._6_2_) * uStack_1e0._6_2_ |
       (ushort)(uStack_1d0._6_2_ >= uStack_1e0._6_2_) * uStack_1d0._6_2_;
  local_1218._0_8_ = SUB168(local_1218,0);
  local_1218._8_8_ = SUB168(local_1218,8);
  local_10d8 = (*palVar48)[0];
  uStack_10d0 = (*palVar48)[1];
  local_10c8 = local_1218._0_8_;
  uStack_10c0 = local_1218._8_8_;
  local_10f8 = local_1218._0_8_ & local_10d8;
  uStack_10f0 = local_1218._8_8_ & uStack_10d0;
  local_108 = 0x4000400040004;
  uStack_100 = 0x3000300030003;
  auVar32._8_8_ = local_10f8;
  auVar32._0_8_ = local_10f8;
  auVar31._8_8_ = 0x3000300030003;
  auVar31._0_8_ = 0x4000400040004;
  local_1228 = paddsw(auVar32,auVar31);
  local_240 = local_1228;
  uVar13 = local_1228._0_8_;
  uVar14 = local_1228._8_8_;
  local_68 = local_11b8._0_8_;
  uStack_60 = local_11b8._8_8_;
  local_58._0_2_ = local_1228._0_2_;
  local_58._2_2_ = local_1228._2_2_;
  local_58._4_2_ = local_1228._4_2_;
  local_58._6_2_ = local_1228._6_2_;
  uStack_50._0_2_ = local_1228._8_2_;
  uStack_50._2_2_ = local_1228._10_2_;
  uStack_50._4_2_ = local_1228._12_2_;
  uStack_50._6_2_ = local_1228._14_2_;
  local_1228._0_2_ =
       (ushort)((short)local_a8 < (short)local_58) * (short)local_a8 |
       (ushort)((short)local_a8 >= (short)local_58) * (short)local_58;
  local_1228._2_2_ =
       (ushort)(local_a8._2_2_ < local_58._2_2_) * local_a8._2_2_ |
       (ushort)(local_a8._2_2_ >= local_58._2_2_) * local_58._2_2_;
  local_1228._4_2_ =
       (ushort)(local_a8._4_2_ < local_58._4_2_) * local_a8._4_2_ |
       (ushort)(local_a8._4_2_ >= local_58._4_2_) * local_58._4_2_;
  local_1228._6_2_ =
       (ushort)(local_a8._6_2_ < local_58._6_2_) * local_a8._6_2_ |
       (ushort)(local_a8._6_2_ >= local_58._6_2_) * local_58._6_2_;
  local_1228._8_2_ =
       (ushort)((short)uStack_a0 < (short)uStack_50) * (short)uStack_a0 |
       (ushort)((short)uStack_a0 >= (short)uStack_50) * (short)uStack_50;
  local_1228._10_2_ =
       (ushort)(uStack_a0._2_2_ < uStack_50._2_2_) * uStack_a0._2_2_ |
       (ushort)(uStack_a0._2_2_ >= uStack_50._2_2_) * uStack_50._2_2_;
  local_1228._12_2_ =
       (ushort)(uStack_a0._4_2_ < uStack_50._4_2_) * uStack_a0._4_2_ |
       (ushort)(uStack_a0._4_2_ >= uStack_50._4_2_) * uStack_50._4_2_;
  local_1228._14_2_ =
       (ushort)(uStack_a0._6_2_ < uStack_50._6_2_) * uStack_a0._6_2_ |
       (ushort)(uStack_a0._6_2_ >= uStack_50._6_2_) * uStack_50._6_2_;
  uVar15 = local_1228._0_8_;
  uVar16 = local_1228._8_8_;
  local_228 = local_11c8._0_8_;
  uStack_220 = local_11c8._8_8_;
  local_218._0_2_ = local_1228._0_2_;
  local_218._2_2_ = local_1228._2_2_;
  local_218._4_2_ = local_1228._4_2_;
  local_218._6_2_ = local_1228._6_2_;
  uStack_210._0_2_ = local_1228._8_2_;
  uStack_210._2_2_ = local_1228._10_2_;
  uStack_210._4_2_ = local_1228._12_2_;
  uStack_210._6_2_ = local_1228._14_2_;
  local_1228._0_2_ =
       (ushort)((short)local_218 < (short)local_1e8) * (short)local_1e8 |
       (ushort)((short)local_218 >= (short)local_1e8) * (short)local_218;
  local_1228._2_2_ =
       (ushort)(local_218._2_2_ < local_1e8._2_2_) * local_1e8._2_2_ |
       (ushort)(local_218._2_2_ >= local_1e8._2_2_) * local_218._2_2_;
  local_1228._4_2_ =
       (ushort)(local_218._4_2_ < local_1e8._4_2_) * local_1e8._4_2_ |
       (ushort)(local_218._4_2_ >= local_1e8._4_2_) * local_218._4_2_;
  local_1228._6_2_ =
       (ushort)(local_218._6_2_ < local_1e8._6_2_) * local_1e8._6_2_ |
       (ushort)(local_218._6_2_ >= local_1e8._6_2_) * local_218._6_2_;
  local_1228._8_2_ =
       (ushort)((short)uStack_210 < (short)uStack_1e0) * (short)uStack_1e0 |
       (ushort)((short)uStack_210 >= (short)uStack_1e0) * (short)uStack_210;
  local_1228._10_2_ =
       (ushort)(uStack_210._2_2_ < uStack_1e0._2_2_) * uStack_1e0._2_2_ |
       (ushort)(uStack_210._2_2_ >= uStack_1e0._2_2_) * uStack_210._2_2_;
  local_1228._12_2_ =
       (ushort)(uStack_210._4_2_ < uStack_1e0._4_2_) * uStack_1e0._4_2_ |
       (ushort)(uStack_210._4_2_ >= uStack_1e0._4_2_) * uStack_210._4_2_;
  local_1228._14_2_ =
       (ushort)(uStack_210._6_2_ < uStack_1e0._6_2_) * uStack_1e0._6_2_ |
       (ushort)(uStack_210._6_2_ >= uStack_1e0._6_2_) * uStack_210._6_2_;
  local_b8 = local_1228._0_8_;
  uStack_b0 = local_1228._8_8_;
  local_bc = 3;
  auVar46 = psraw(local_1228,ZEXT416(3));
  local_1228._0_8_ = auVar46._0_8_;
  local_1228._8_8_ = auVar46._8_8_;
  uStack_1120 = local_1228._8_8_;
  local_1108 = local_1228._0_8_;
  uStack_1100 = local_1228._8_8_;
  local_1118 = local_1228._0_8_;
  uStack_1110 = local_1228._8_8_;
  local_118 = local_1228._0_8_;
  uStack_110 = local_1228._0_8_;
  local_128 = 0x1000100010001;
  uStack_120 = 0x1000100010001;
  auVar30._8_8_ = local_1228._0_8_;
  auVar30._0_8_ = local_1228._0_8_;
  auVar29._8_8_ = 0x1000100010001;
  auVar29._0_8_ = 0x1000100010001;
  auVar45 = paddsw(auVar30,auVar29);
  local_1218._0_8_ = auVar45._0_8_;
  local_1218._8_8_ = auVar45._8_8_;
  local_d8 = local_1218._0_8_;
  uStack_d0 = local_1218._8_8_;
  local_dc = 1;
  auVar45 = psraw(auVar45,ZEXT416(1));
  local_538 = (*palVar47)[0];
  uStack_530 = (*palVar47)[1];
  local_1218._0_8_ = auVar45._0_8_;
  local_1218._8_8_ = auVar45._8_8_;
  local_548 = local_1218._0_8_;
  uStack_540 = local_1218._8_8_;
  uStack_1240 = ~local_538 & local_1218._0_8_;
  uStack_1130 = ~uStack_530 & local_1218._8_8_;
  local_1218._8_8_ = uStack_1130;
  local_1218._0_8_ = uStack_1240;
  auVar45 = local_1218;
  local_1228._12_4_ = auVar46._12_4_;
  uVar40 = local_1228._12_4_;
  local_1218._0_4_ = (undefined4)uStack_1240;
  local_1218._12_4_ = (undefined4)(uStack_1130 >> 0x20);
  uStack_58c = local_1228._12_4_;
  _local_588 = CONCAT44(uStack_584,local_1218._0_4_);
  uStack_59c = local_1218._12_4_;
  _local_598 = CONCAT44(auVar46._4_4_,local_1208._0_4_);
  uStack_1230 = uStack_590;
  uStack_122c = local_1228._12_4_;
  local_1228._4_4_ = local_1218._12_4_;
  local_1228._0_4_ = uStack_5a0;
  local_1228 = CONCAT88(uStack_1120,local_1228._0_8_);
  local_1128 = local_1228._0_8_;
  local_1248 = local_1228._0_8_;
  local_478 = local_11f8._0_8_;
  uStack_470 = local_11f8._8_8_;
  local_488 = local_1228._0_8_;
  auVar46._8_8_ = uStack_1240;
  auVar46._0_8_ = local_1228._0_8_;
  local_11f8 = psubsw(auVar44,auVar46);
  uStack_140 = CONCAT44(uVar40,uStack_590);
  local_138 = local_11e8._0_8_;
  uStack_130 = local_11e8._8_8_;
  local_148 = local_1238;
  auVar44._8_8_ = uStack_140;
  auVar44._0_8_ = local_1238;
  local_11e8 = paddsw(auVar43,auVar44);
  local_280 = local_11f8;
  uVar17 = local_11f8._0_8_;
  uVar18 = local_11f8._8_8_;
  local_48 = local_11b8._0_8_;
  uStack_40 = local_11b8._8_8_;
  local_38._0_2_ = local_11f8._0_2_;
  local_38._2_2_ = local_11f8._2_2_;
  local_38._4_2_ = local_11f8._4_2_;
  local_38._6_2_ = local_11f8._6_2_;
  uStack_30._0_2_ = local_11f8._8_2_;
  uStack_30._2_2_ = local_11f8._10_2_;
  uStack_30._4_2_ = local_11f8._12_2_;
  uStack_30._6_2_ = local_11f8._14_2_;
  local_11f8._0_2_ =
       (ushort)((short)local_a8 < (short)local_38) * (short)local_a8 |
       (ushort)((short)local_a8 >= (short)local_38) * (short)local_38;
  local_11f8._2_2_ =
       (ushort)(local_a8._2_2_ < local_38._2_2_) * local_a8._2_2_ |
       (ushort)(local_a8._2_2_ >= local_38._2_2_) * local_38._2_2_;
  local_11f8._4_2_ =
       (ushort)(local_a8._4_2_ < local_38._4_2_) * local_a8._4_2_ |
       (ushort)(local_a8._4_2_ >= local_38._4_2_) * local_38._4_2_;
  local_11f8._6_2_ =
       (ushort)(local_a8._6_2_ < local_38._6_2_) * local_a8._6_2_ |
       (ushort)(local_a8._6_2_ >= local_38._6_2_) * local_38._6_2_;
  local_11f8._8_2_ =
       (ushort)((short)uStack_a0 < (short)uStack_30) * (short)uStack_a0 |
       (ushort)((short)uStack_a0 >= (short)uStack_30) * (short)uStack_30;
  local_11f8._10_2_ =
       (ushort)(uStack_a0._2_2_ < uStack_30._2_2_) * uStack_a0._2_2_ |
       (ushort)(uStack_a0._2_2_ >= uStack_30._2_2_) * uStack_30._2_2_;
  local_11f8._12_2_ =
       (ushort)(uStack_a0._4_2_ < uStack_30._4_2_) * uStack_a0._4_2_ |
       (ushort)(uStack_a0._4_2_ >= uStack_30._4_2_) * uStack_30._4_2_;
  local_11f8._14_2_ =
       (ushort)(uStack_a0._6_2_ < uStack_30._6_2_) * uStack_a0._6_2_ |
       (ushort)(uStack_a0._6_2_ >= uStack_30._6_2_) * uStack_30._6_2_;
  uVar19 = local_11f8._0_8_;
  uVar20 = local_11f8._8_8_;
  local_268 = local_11c8._0_8_;
  uStack_260 = local_11c8._8_8_;
  local_258._0_2_ = local_11f8._0_2_;
  local_258._2_2_ = local_11f8._2_2_;
  local_258._4_2_ = local_11f8._4_2_;
  local_258._6_2_ = local_11f8._6_2_;
  uStack_250._0_2_ = local_11f8._8_2_;
  uStack_250._2_2_ = local_11f8._10_2_;
  uStack_250._4_2_ = local_11f8._12_2_;
  uStack_250._6_2_ = local_11f8._14_2_;
  local_11f8._0_2_ =
       (ushort)((short)local_258 < (short)local_1e8) * (short)local_1e8 |
       (ushort)((short)local_258 >= (short)local_1e8) * (short)local_258;
  local_11f8._2_2_ =
       (ushort)(local_258._2_2_ < local_1e8._2_2_) * local_1e8._2_2_ |
       (ushort)(local_258._2_2_ >= local_1e8._2_2_) * local_258._2_2_;
  local_11f8._4_2_ =
       (ushort)(local_258._4_2_ < local_1e8._4_2_) * local_1e8._4_2_ |
       (ushort)(local_258._4_2_ >= local_1e8._4_2_) * local_258._4_2_;
  local_11f8._6_2_ =
       (ushort)(local_258._6_2_ < local_1e8._6_2_) * local_1e8._6_2_ |
       (ushort)(local_258._6_2_ >= local_1e8._6_2_) * local_258._6_2_;
  local_11f8._8_2_ =
       (ushort)((short)uStack_250 < (short)uStack_1e0) * (short)uStack_1e0 |
       (ushort)((short)uStack_250 >= (short)uStack_1e0) * (short)uStack_250;
  local_11f8._10_2_ =
       (ushort)(uStack_250._2_2_ < uStack_1e0._2_2_) * uStack_1e0._2_2_ |
       (ushort)(uStack_250._2_2_ >= uStack_1e0._2_2_) * uStack_250._2_2_;
  local_11f8._12_2_ =
       (ushort)(uStack_250._4_2_ < uStack_1e0._4_2_) * uStack_1e0._4_2_ |
       (ushort)(uStack_250._4_2_ >= uStack_1e0._4_2_) * uStack_250._4_2_;
  local_11f8._14_2_ =
       (ushort)(uStack_250._6_2_ < uStack_1e0._6_2_) * uStack_1e0._6_2_ |
       (ushort)(uStack_250._6_2_ >= uStack_1e0._6_2_) * uStack_250._6_2_;
  local_2c0 = local_11e8;
  uVar21 = local_11e8._0_8_;
  uVar22 = local_11e8._8_8_;
  local_28 = local_11b8._0_8_;
  uStack_20 = local_11b8._8_8_;
  local_18._0_2_ = local_11e8._0_2_;
  local_18._2_2_ = local_11e8._2_2_;
  local_18._4_2_ = local_11e8._4_2_;
  local_18._6_2_ = local_11e8._6_2_;
  uStack_10._0_2_ = local_11e8._8_2_;
  uStack_10._2_2_ = local_11e8._10_2_;
  uStack_10._4_2_ = local_11e8._12_2_;
  uStack_10._6_2_ = local_11e8._14_2_;
  local_11e8._0_2_ =
       (ushort)((short)local_a8 < (short)local_18) * (short)local_a8 |
       (ushort)((short)local_a8 >= (short)local_18) * (short)local_18;
  local_11e8._2_2_ =
       (ushort)(local_a8._2_2_ < local_18._2_2_) * local_a8._2_2_ |
       (ushort)(local_a8._2_2_ >= local_18._2_2_) * local_18._2_2_;
  local_11e8._4_2_ =
       (ushort)(local_a8._4_2_ < local_18._4_2_) * local_a8._4_2_ |
       (ushort)(local_a8._4_2_ >= local_18._4_2_) * local_18._4_2_;
  local_11e8._6_2_ =
       (ushort)(local_a8._6_2_ < local_18._6_2_) * local_a8._6_2_ |
       (ushort)(local_a8._6_2_ >= local_18._6_2_) * local_18._6_2_;
  local_11e8._8_2_ =
       (ushort)((short)uStack_a0 < (short)uStack_10) * (short)uStack_a0 |
       (ushort)((short)uStack_a0 >= (short)uStack_10) * (short)uStack_10;
  local_11e8._10_2_ =
       (ushort)(uStack_a0._2_2_ < uStack_10._2_2_) * uStack_a0._2_2_ |
       (ushort)(uStack_a0._2_2_ >= uStack_10._2_2_) * uStack_10._2_2_;
  local_11e8._12_2_ =
       (ushort)(uStack_a0._4_2_ < uStack_10._4_2_) * uStack_a0._4_2_ |
       (ushort)(uStack_a0._4_2_ >= uStack_10._4_2_) * uStack_10._4_2_;
  local_11e8._14_2_ =
       (ushort)(uStack_a0._6_2_ < uStack_10._6_2_) * uStack_a0._6_2_ |
       (ushort)(uStack_a0._6_2_ >= uStack_10._6_2_) * uStack_10._6_2_;
  uVar23 = local_11e8._0_8_;
  uVar24 = local_11e8._8_8_;
  local_2a8 = local_11c8._0_8_;
  uStack_2a0 = local_11c8._8_8_;
  local_298._0_2_ = local_11e8._0_2_;
  local_298._2_2_ = local_11e8._2_2_;
  local_298._4_2_ = local_11e8._4_2_;
  local_298._6_2_ = local_11e8._6_2_;
  uStack_290._0_2_ = local_11e8._8_2_;
  uStack_290._2_2_ = local_11e8._10_2_;
  uStack_290._4_2_ = local_11e8._12_2_;
  uStack_290._6_2_ = local_11e8._14_2_;
  local_11e8._0_2_ =
       (ushort)((short)local_298 < (short)local_1e8) * (short)local_1e8 |
       (ushort)((short)local_298 >= (short)local_1e8) * (short)local_298;
  local_11e8._2_2_ =
       (ushort)(local_298._2_2_ < local_1e8._2_2_) * local_1e8._2_2_ |
       (ushort)(local_298._2_2_ >= local_1e8._2_2_) * local_298._2_2_;
  local_11e8._4_2_ =
       (ushort)(local_298._4_2_ < local_1e8._4_2_) * local_1e8._4_2_ |
       (ushort)(local_298._4_2_ >= local_1e8._4_2_) * local_298._4_2_;
  local_11e8._6_2_ =
       (ushort)(local_298._6_2_ < local_1e8._6_2_) * local_1e8._6_2_ |
       (ushort)(local_298._6_2_ >= local_1e8._6_2_) * local_298._6_2_;
  local_11e8._8_2_ =
       (ushort)((short)uStack_290 < (short)uStack_1e0) * (short)uStack_1e0 |
       (ushort)((short)uStack_290 >= (short)uStack_1e0) * (short)uStack_290;
  local_11e8._10_2_ =
       (ushort)(uStack_290._2_2_ < uStack_1e0._2_2_) * uStack_1e0._2_2_ |
       (ushort)(uStack_290._2_2_ >= uStack_1e0._2_2_) * uStack_290._2_2_;
  local_11e8._12_2_ =
       (ushort)(uStack_290._4_2_ < uStack_1e0._4_2_) * uStack_1e0._4_2_ |
       (ushort)(uStack_290._4_2_ >= uStack_1e0._4_2_) * uStack_290._4_2_;
  local_11e8._14_2_ =
       (ushort)(uStack_290._6_2_ < uStack_1e0._6_2_) * uStack_1e0._6_2_ |
       (ushort)(uStack_290._6_2_ >= uStack_1e0._6_2_) * uStack_290._6_2_;
  auVar37._8_8_ = lStack_14e0;
  auVar37._0_8_ = local_14e8;
  local_158 = local_11f8._0_8_;
  uStack_150 = local_11f8._8_8_;
  auVar46 = paddsw(local_11f8,auVar37);
  uStack_154c = auVar46._12_4_;
  local_1558 = auVar46._0_8_;
  auVar38._8_8_ = lStack_14e0;
  auVar38._0_8_ = local_14e8;
  local_178 = local_11e8._0_8_;
  uStack_170 = local_11e8._8_8_;
  auVar46 = paddsw(local_11e8,auVar38);
  uStack_153c = auVar46._12_4_;
  uStack_1544 = auVar46._4_4_;
  local_1548 = auVar46._0_4_;
  local_1218 = auVar45;
  local_11c8 = auVar42;
  local_1168 = palVar48;
  local_1160 = palVar47;
  local_1158 = abs_p1p0_00;
  local_1150 = l;
  local_1138 = uStack_1240;
  local_10e8 = local_10f8;
  uStack_10e0 = uStack_10f0;
  local_5a8 = uStack_1240;
  local_498 = local_11a8;
  uStack_490 = uStack_11a0;
  uStack_480 = uStack_1240;
  local_368 = local_11a8;
  uStack_360 = uStack_11a0;
  local_308 = local_11a8;
  uStack_300 = uStack_11a0;
  local_2e8 = local_11d8;
  uStack_2e0 = uStack_11d0;
  local_298 = uVar23;
  uStack_290 = uVar24;
  local_278 = local_2b8;
  local_270 = local_2b0;
  local_258 = uVar19;
  uStack_250 = uVar20;
  local_238 = local_2b8;
  local_230 = local_2b0;
  local_218 = uVar15;
  uStack_210 = uVar16;
  local_1f8 = local_2b8;
  local_1f0 = local_2b0;
  local_1e8 = uVar11;
  uStack_1e0 = uVar12;
  local_1d8 = uVar9;
  uStack_1d0 = uVar10;
  local_1b8 = local_2b8;
  local_1b0 = local_2b0;
  local_1a8 = uVar5;
  uStack_1a0 = uVar6;
  local_198 = uVar3;
  uStack_190 = uVar4;
  local_f8 = local_10f8;
  uStack_f0 = local_10f8;
  local_a8 = local_11b8._0_8_;
  uStack_a0 = local_11b8._8_8_;
  local_98 = uVar1;
  uStack_90 = uVar2;
  local_78 = uVar7;
  uStack_70 = uVar8;
  local_58 = uVar13;
  uStack_50 = uVar14;
  local_38 = uVar17;
  uStack_30 = uVar18;
  local_18 = uVar21;
  uStack_10 = uVar22;
  highbd_flat_mask4_sse2
            (l,(__m128i *)
               CONCAT26(in_stack_ffffffffffffe62e,
                        CONCAT24(in_stack_ffffffffffffe62c,in_stack_ffffffffffffe628)),p1p0_00,
             (int)((ulong)q1q0_00 >> 0x20));
  puVar39 = local_1470;
  local_1028 = local_1568;
  uStack_1020 = uStack_1560;
  local_1038 = local_14f8;
  uStack_1030 = uStack_14f0;
  local_1058 = local_1568 & local_14f8;
  uStack_1050 = uStack_1560 & uStack_14f0;
  local_1048 = local_1578;
  uStack_1040 = uStack_1570;
  local_1278 = local_1578 & local_1058;
  local_1258 = local_1058;
  uStack_1250 = uStack_1050;
  local_1268 = local_1058;
  uStack_1260 = uStack_1050;
  local_1568 = local_1058;
  uStack_1560 = local_1058;
  uStack_1270 = uStack_1570 & uStack_1050;
  local_1288 = local_1278;
  uStack_1280 = uStack_1570 & uStack_1050;
  local_1578 = local_1278;
  uStack_1570 = local_1278;
  local_fc8 = local_1058;
  uStack_fc0 = local_1058;
  local_fd8 = local_14a8;
  uStack_fd0 = uStack_14a0;
  local_fc8._0_2_ = (short)local_1058;
  local_fc8._2_2_ = (short)(local_1058 >> 0x10);
  local_fc8._4_2_ = (short)(local_1058 >> 0x20);
  local_fc8._6_2_ = (short)(local_1058 >> 0x30);
  local_fd8._0_2_ = (short)local_14a8;
  local_fd8._2_2_ = (short)((ulong)local_14a8 >> 0x10);
  local_fd8._4_2_ = (short)((ulong)local_14a8 >> 0x20);
  local_fd8._6_2_ = (short)((ulong)local_14a8 >> 0x30);
  uStack_fd0._0_2_ = (short)uStack_14a0;
  uStack_fd0._2_2_ = (short)((ulong)uStack_14a0 >> 0x10);
  uStack_fd0._4_2_ = (short)((ulong)uStack_14a0 >> 0x20);
  uStack_fd0._6_2_ = (short)((ulong)uStack_14a0 >> 0x30);
  uStack_ffa = -(ushort)(local_fc8._6_2_ == uStack_fd0._6_2_);
  local_1008 = -(ushort)((short)local_fc8 == (short)local_fd8);
  sStack_1006 = -(ushort)(local_fc8._2_2_ == local_fd8._2_2_);
  sStack_1004 = -(ushort)(local_fc8._4_2_ == local_fd8._4_2_);
  sStack_1002 = -(ushort)(local_fc8._6_2_ == local_fd8._6_2_);
  sStack_1000 = -(ushort)((short)local_fc8 == (short)uStack_fd0);
  sStack_ffe = -(ushort)(local_fc8._2_2_ == uStack_fd0._2_2_);
  sStack_ffc = -(ushort)(local_fc8._4_2_ == uStack_fd0._4_2_);
  auVar45._2_2_ = -(ushort)(local_fc8._2_2_ == local_fd8._2_2_);
  auVar45._0_2_ = -(ushort)((short)local_fc8 == (short)local_fd8);
  auVar45._4_2_ = -(ushort)(local_fc8._4_2_ == local_fd8._4_2_);
  auVar45._6_2_ = -(ushort)(local_fc8._6_2_ == local_fd8._6_2_);
  auVar45._8_2_ = -(ushort)((short)local_fc8 == (short)uStack_fd0);
  auVar45._10_2_ = -(ushort)(local_fc8._2_2_ == uStack_fd0._2_2_);
  auVar45._12_2_ = -(ushort)(local_fc8._4_2_ == uStack_fd0._4_2_);
  auVar45._14_2_ = uStack_ffa;
  if ((ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) | (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(uStack_ffa >> 7) & 1) << 0xe | uStack_ffa & 0x8000) == 0xffff) {
    local_12a8 = local_1558;
    *local_1470 = CONCAT44(uStack_1544,local_1548);
    puVar39[1] = local_1558;
    *(undefined4 *)(local_1470 + 3) = uStack_550;
    *(undefined4 *)((long)local_1470 + 0x1c) = uStack_153c;
    *(undefined4 *)(local_1470 + 4) = uStack_560;
    *(undefined4 *)((long)local_1470 + 0x24) = uStack_154c;
  }
  else {
    local_faa = 8;
    local_1758 = 0x8000800080008;
    uStack_1750 = 0x8000800080008;
    local_fac = 4;
    local_1768 = 0x4000400040004;
    uStack_1760 = 0x4000400040004;
    uVar1 = local_1470[6];
    uVar2 = local_1470[7];
    uVar3 = local_1470[8];
    uVar4 = local_1470[9];
    uVar5 = local_1470[10];
    uVar6 = local_1470[0xb];
    local_898 = (short)uVar3;
    sStack_896 = (short)((ulong)uVar3 >> 0x10);
    sStack_894 = (short)((ulong)uVar3 >> 0x20);
    sStack_892 = (short)((ulong)uVar3 >> 0x30);
    sStack_890 = (short)uVar4;
    sStack_88e = (short)((ulong)uVar4 >> 0x10);
    sStack_88c = (short)((ulong)uVar4 >> 0x20);
    sStack_88a = (short)((ulong)uVar4 >> 0x30);
    local_8a8 = (short)uVar1;
    sStack_8a6 = (short)((ulong)uVar1 >> 0x10);
    sStack_8a4 = (short)((ulong)uVar1 >> 0x20);
    sStack_8a2 = (short)((ulong)uVar1 >> 0x30);
    sStack_8a0 = (short)uVar2;
    sStack_89e = (short)((ulong)uVar2 >> 0x10);
    sStack_89c = (short)((ulong)uVar2 >> 0x20);
    sStack_89a = (short)((ulong)uVar2 >> 0x30);
    local_8c8 = local_898 + local_8a8;
    sStack_8c6 = sStack_896 + sStack_8a6;
    sStack_8c4 = sStack_894 + sStack_8a4;
    sStack_8c2 = sStack_892 + sStack_8a2;
    local_8b8 = (short)uVar5;
    sStack_8b6 = (short)((ulong)uVar5 >> 0x10);
    sStack_8b4 = (short)((ulong)uVar5 >> 0x20);
    sStack_8b2 = (short)((ulong)uVar5 >> 0x30);
    sStack_8b0 = (short)uVar6;
    sStack_8ae = (short)((ulong)uVar6 >> 0x10);
    sStack_8ac = (short)((ulong)uVar6 >> 0x20);
    sStack_8aa = (short)((ulong)uVar6 >> 0x30);
    local_8b8 = local_8b8 + local_898 + local_8a8;
    sStack_8b6 = sStack_8b6 + sStack_896 + sStack_8a6;
    sStack_8b4 = sStack_8b4 + sStack_894 + sStack_8a4;
    sStack_8b2 = sStack_8b2 + sStack_892 + sStack_8a2;
    sStack_8b0 = sStack_8b0 + sStack_890 + sStack_8a0;
    sStack_8ae = sStack_8ae + sStack_88e + sStack_89e;
    sStack_8ac = sStack_8ac + sStack_88c + sStack_89c;
    sStack_8aa = sStack_8aa + sStack_88a + sStack_89a;
    uVar1 = *local_1470;
    uVar2 = local_1470[1];
    uVar3 = local_1470[2];
    uVar4 = local_1470[3];
    uVar5 = local_1470[4];
    uVar6 = local_1470[5];
    local_8d8 = uVar5;
    uStack_8d0 = uVar6;
    local_8e8 = uVar3;
    uStack_8e0 = uVar4;
    local_8d8._0_2_ = (short)uVar5;
    local_8d8._2_2_ = (short)((ulong)uVar5 >> 0x10);
    local_8d8._4_2_ = (short)((ulong)uVar5 >> 0x20);
    local_8d8._6_2_ = (short)((ulong)uVar5 >> 0x30);
    uStack_8d0._0_2_ = (short)uVar6;
    uStack_8d0._2_2_ = (short)((ulong)uVar6 >> 0x10);
    uStack_8d0._4_2_ = (short)((ulong)uVar6 >> 0x20);
    uStack_8d0._6_2_ = (short)((ulong)uVar6 >> 0x30);
    local_8e8._0_2_ = (short)uVar3;
    local_8e8._2_2_ = (short)((ulong)uVar3 >> 0x10);
    local_8e8._4_2_ = (short)((ulong)uVar3 >> 0x20);
    local_8e8._6_2_ = (short)((ulong)uVar3 >> 0x30);
    uStack_8e0._0_2_ = (short)uVar4;
    uStack_8e0._2_2_ = (short)((ulong)uVar4 >> 0x10);
    uStack_8e0._4_2_ = (short)((ulong)uVar4 >> 0x20);
    uStack_8e0._6_2_ = (short)((ulong)uVar4 >> 0x30);
    local_8f8 = uVar1;
    uStack_8f0 = uVar2;
    local_908 = (short)local_8d8 + (short)local_8e8;
    sStack_906 = local_8d8._2_2_ + local_8e8._2_2_;
    sStack_904 = local_8d8._4_2_ + local_8e8._4_2_;
    sStack_902 = local_8d8._6_2_ + local_8e8._6_2_;
    sStack_900 = (short)uStack_8d0 + (short)uStack_8e0;
    sStack_8fe = uStack_8d0._2_2_ + uStack_8e0._2_2_;
    sStack_8fc = uStack_8d0._4_2_ + uStack_8e0._4_2_;
    sStack_8fa = uStack_8d0._6_2_ + uStack_8e0._6_2_;
    local_8f8._0_2_ = (short)uVar1;
    local_8f8._2_2_ = (short)((ulong)uVar1 >> 0x10);
    local_8f8._4_2_ = (short)((ulong)uVar1 >> 0x20);
    local_8f8._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_8f0._0_2_ = (short)uVar2;
    uStack_8f0._2_2_ = (short)((ulong)uVar2 >> 0x10);
    uStack_8f0._4_2_ = (short)((ulong)uVar2 >> 0x20);
    uStack_8f0._6_2_ = (short)((ulong)uVar2 >> 0x30);
    local_8f8._0_2_ = (short)local_8f8 + (short)local_8d8 + (short)local_8e8;
    local_8f8._2_2_ = local_8f8._2_2_ + local_8d8._2_2_ + local_8e8._2_2_;
    local_8f8._4_2_ = local_8f8._4_2_ + local_8d8._4_2_ + local_8e8._4_2_;
    local_8f8._6_2_ = local_8f8._6_2_ + local_8d8._6_2_ + local_8e8._6_2_;
    sStack_9a0 = (short)uStack_8f0 + (short)uStack_8d0 + (short)uStack_8e0;
    sStack_99e = uStack_8f0._2_2_ + uStack_8d0._2_2_ + uStack_8e0._2_2_;
    sStack_99c = uStack_8f0._4_2_ + uStack_8d0._4_2_ + uStack_8e0._4_2_;
    sStack_99a = uStack_8f0._6_2_ + uStack_8d0._6_2_ + uStack_8e0._6_2_;
    local_918 = CONCAT26(sStack_8b2,CONCAT24(sStack_8b4,CONCAT22(sStack_8b6,local_8b8)));
    uStack_910 = CONCAT26(sStack_8aa,CONCAT24(sStack_8ac,CONCAT22(sStack_8ae,sStack_8b0)));
    local_928 = CONCAT26(local_8f8._6_2_,
                         CONCAT24(local_8f8._4_2_,CONCAT22(local_8f8._2_2_,(short)local_8f8)));
    uStack_920 = CONCAT26(sStack_99a,CONCAT24(sStack_99c,CONCAT22(sStack_99e,sStack_9a0)));
    local_8b8 = local_8b8 + (short)local_8f8;
    sStack_8b6 = sStack_8b6 + local_8f8._2_2_;
    sStack_8b4 = sStack_8b4 + local_8f8._4_2_;
    sStack_8b2 = sStack_8b2 + local_8f8._6_2_;
    sStack_960 = sStack_8b0 + sStack_9a0;
    sStack_95e = sStack_8ae + sStack_99e;
    sStack_95c = sStack_8ac + sStack_99c;
    sStack_95a = sStack_8aa + sStack_99a;
    local_938 = CONCAT26(sStack_8b2,CONCAT24(sStack_8b4,CONCAT22(sStack_8b6,local_8b8)));
    uStack_930 = CONCAT26(sStack_95a,CONCAT24(sStack_95c,CONCAT22(sStack_95e,sStack_960)));
    local_948 = CONCAT26(sStack_95a,CONCAT24(sStack_95c,CONCAT22(sStack_95e,sStack_960)));
    uStack_940 = 0;
    local_968 = local_8b8 + sStack_960;
    sStack_966 = sStack_8b6 + sStack_95e;
    sStack_964 = sStack_8b4 + sStack_95c;
    sStack_962 = sStack_8b2 + sStack_95a;
    local_958 = 0x8000800080008;
    uStack_950 = 0x8000800080008;
    local_17a8 = local_968 + 8;
    sStack_17a6 = sStack_966 + 8;
    sStack_17a4 = sStack_964 + 8;
    sStack_17a2 = sStack_962 + 8;
    sStack_17a0 = sStack_960 + 8;
    sStack_179e = sStack_95e + 8;
    sStack_179c = sStack_95c + 8;
    sStack_179a = sStack_95a + 8;
    local_978 = CONCAT26(local_8f8._6_2_,
                         CONCAT24(local_8f8._4_2_,CONCAT22(local_8f8._2_2_,(short)local_8f8)));
    uStack_970 = CONCAT26(sStack_99a,CONCAT24(sStack_99c,CONCAT22(sStack_99e,sStack_9a0)));
    local_988 = CONCAT26(sStack_99a,CONCAT24(sStack_99c,CONCAT22(sStack_99e,sStack_9a0)));
    uStack_980 = 0;
    local_998 = 0x4000400040004;
    uStack_990 = 0x4000400040004;
    local_9a8 = (short)local_8f8 + sStack_9a0;
    sStack_9a6 = local_8f8._2_2_ + sStack_99e;
    sStack_9a4 = local_8f8._4_2_ + sStack_99c;
    sStack_9a2 = local_8f8._6_2_ + sStack_99a;
    local_17c8 = (short)local_8f8 + sStack_9a0 + 4;
    sStack_17c6 = local_8f8._2_2_ + sStack_99e + 4;
    sStack_17c4 = local_8f8._4_2_ + sStack_99c + 4;
    sStack_17c2 = local_8f8._6_2_ + sStack_99a + 4;
    sStack_9a0 = sStack_9a0 + 4;
    sStack_99e = sStack_99e + 4;
    sStack_99c = sStack_99c + 4;
    sStack_99a = sStack_99a + 4;
    uVar1 = *local_1470;
    uVar2 = local_1470[1];
    uVar3 = local_1470[6];
    uVar4 = local_1470[7];
    local_9b8 = uVar3;
    uStack_9b0 = uVar4;
    local_9c8 = uVar1;
    uStack_9c0 = uVar2;
    local_9b8._0_2_ = (short)uVar3;
    local_9b8._2_2_ = (short)((ulong)uVar3 >> 0x10);
    local_9b8._4_2_ = (short)((ulong)uVar3 >> 0x20);
    local_9b8._6_2_ = (short)((ulong)uVar3 >> 0x30);
    uStack_9b0._0_2_ = (short)uVar4;
    uStack_9b0._2_2_ = (short)((ulong)uVar4 >> 0x10);
    uStack_9b0._4_2_ = (short)((ulong)uVar4 >> 0x20);
    uStack_9b0._6_2_ = (short)((ulong)uVar4 >> 0x30);
    local_9c8._0_2_ = (short)uVar1;
    local_9c8._2_2_ = (short)((ulong)uVar1 >> 0x10);
    local_9c8._4_2_ = (short)((ulong)uVar1 >> 0x20);
    local_9c8._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_9c0._0_2_ = (short)uVar2;
    uStack_9c0._2_2_ = (short)((ulong)uVar2 >> 0x10);
    uStack_9c0._4_2_ = (short)((ulong)uVar2 >> 0x20);
    uStack_9c0._6_2_ = (short)((ulong)uVar2 >> 0x30);
    local_9d8 = CONCAT26(sStack_17c2,CONCAT24(sStack_17c4,CONCAT22(sStack_17c6,local_17c8)));
    uStack_9d0 = CONCAT26(sStack_99a,CONCAT24(sStack_99c,CONCAT22(sStack_99e,sStack_9a0)));
    local_9e8 = (short)local_9b8 + (short)local_9c8;
    sStack_9e6 = local_9b8._2_2_ + local_9c8._2_2_;
    sStack_9e4 = local_9b8._4_2_ + local_9c8._4_2_;
    sStack_9e2 = local_9b8._6_2_ + local_9c8._6_2_;
    sStack_9e0 = (short)uStack_9b0 + (short)uStack_9c0;
    sStack_9de = uStack_9b0._2_2_ + uStack_9c0._2_2_;
    sStack_9dc = uStack_9b0._4_2_ + uStack_9c0._4_2_;
    sStack_9da = uStack_9b0._6_2_ + uStack_9c0._6_2_;
    local_15a8 = local_17c8 + (short)local_9b8 + (short)local_9c8;
    uStack_15a6 = sStack_17c6 + local_9b8._2_2_ + local_9c8._2_2_;
    uStack_15a4 = sStack_17c4 + local_9b8._4_2_ + local_9c8._4_2_;
    uStack_15a2 = sStack_17c2 + local_9b8._6_2_ + local_9c8._6_2_;
    sStack_15a0 = sStack_9a0 + (short)uStack_9b0 + (short)uStack_9c0;
    sStack_159e = sStack_99e + uStack_9b0._2_2_ + uStack_9c0._2_2_;
    sStack_159c = sStack_99c + uStack_9b0._4_2_ + uStack_9c0._4_2_;
    sStack_159a = sStack_99a + uStack_9b0._6_2_ + uStack_9c0._6_2_;
    uVar1 = *local_1468;
    uVar2 = local_1468[1];
    uVar3 = local_1468[6];
    uVar4 = local_1468[7];
    local_9f8 = uVar3;
    uStack_9f0 = uVar4;
    local_a08 = uVar1;
    uStack_a00 = uVar2;
    local_9f8._0_2_ = (short)uVar3;
    local_9f8._2_2_ = (short)((ulong)uVar3 >> 0x10);
    local_9f8._4_2_ = (short)((ulong)uVar3 >> 0x20);
    local_9f8._6_2_ = (short)((ulong)uVar3 >> 0x30);
    uStack_9f0._0_2_ = (short)uVar4;
    uStack_9f0._2_2_ = (short)((ulong)uVar4 >> 0x10);
    uStack_9f0._4_2_ = (short)((ulong)uVar4 >> 0x20);
    uStack_9f0._6_2_ = (short)((ulong)uVar4 >> 0x30);
    local_a08._0_2_ = (short)uVar1;
    local_a08._2_2_ = (short)((ulong)uVar1 >> 0x10);
    local_a08._4_2_ = (short)((ulong)uVar1 >> 0x20);
    local_a08._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_a00._0_2_ = (short)uVar2;
    uStack_a00._2_2_ = (short)((ulong)uVar2 >> 0x10);
    uStack_a00._4_2_ = (short)((ulong)uVar2 >> 0x20);
    uStack_a00._6_2_ = (short)((ulong)uVar2 >> 0x30);
    local_a18 = CONCAT26(sStack_17c2,CONCAT24(sStack_17c4,CONCAT22(sStack_17c6,local_17c8)));
    uStack_a10 = CONCAT26(sStack_99a,CONCAT24(sStack_99c,CONCAT22(sStack_99e,sStack_9a0)));
    local_a28 = (short)local_9f8 + (short)local_a08;
    sStack_a26 = local_9f8._2_2_ + local_a08._2_2_;
    sStack_a24 = local_9f8._4_2_ + local_a08._4_2_;
    sStack_a22 = local_9f8._6_2_ + local_a08._6_2_;
    sStack_a20 = (short)uStack_9f0 + (short)uStack_a00;
    sStack_a1e = uStack_9f0._2_2_ + uStack_a00._2_2_;
    sStack_a1c = uStack_9f0._4_2_ + uStack_a00._4_2_;
    sStack_a1a = uStack_9f0._6_2_ + uStack_a00._6_2_;
    local_15d8 = local_17c8 + (short)local_9f8 + (short)local_a08;
    uStack_15d6 = sStack_17c6 + local_9f8._2_2_ + local_a08._2_2_;
    uStack_15d4 = sStack_17c4 + local_9f8._4_2_ + local_a08._4_2_;
    uStack_15d2 = sStack_17c2 + local_9f8._6_2_ + local_a08._6_2_;
    sStack_15d0 = sStack_9a0 + (short)uStack_9f0 + (short)uStack_a00;
    sStack_15ce = sStack_99e + uStack_9f0._2_2_ + uStack_a00._2_2_;
    sStack_15cc = sStack_99c + uStack_9f0._4_2_ + uStack_a00._4_2_;
    sStack_15ca = sStack_99a + uStack_9f0._6_2_ + uStack_a00._6_2_;
    local_a48 = local_1470[0xc];
    uStack_a40 = local_1470[0xd];
    local_a38 = local_a48;
    uStack_a30 = uStack_a40;
    local_a38._0_2_ = (short)local_a48;
    local_a38._2_2_ = (short)((ulong)local_a48 >> 0x10);
    local_a38._4_2_ = (short)((ulong)local_a48 >> 0x20);
    local_a38._6_2_ = (short)((ulong)local_a48 >> 0x30);
    uStack_a30._0_2_ = (short)uStack_a40;
    uStack_a30._2_2_ = (short)((ulong)uStack_a40 >> 0x10);
    uStack_a30._4_2_ = (short)((ulong)uStack_a40 >> 0x20);
    uStack_a30._6_2_ = (short)((ulong)uStack_a40 >> 0x30);
    local_1738 = (short)local_a38 * 2;
    sStack_1736 = local_a38._2_2_ * 2;
    sStack_1734 = local_a38._4_2_ * 2;
    sStack_1732 = local_a38._6_2_ * 2;
    sStack_1730 = (short)uStack_a30 * 2;
    sStack_172e = uStack_a30._2_2_ * 2;
    sStack_172c = uStack_a30._4_2_ * 2;
    sStack_172a = uStack_a30._6_2_ * 2;
    local_a68 = local_1470[6];
    uStack_a60 = local_1470[7];
    local_a58 = local_a68;
    uStack_a50 = uStack_a60;
    local_a58._0_2_ = (short)local_a68;
    local_a58._2_2_ = (short)((ulong)local_a68 >> 0x10);
    local_a58._4_2_ = (short)((ulong)local_a68 >> 0x20);
    local_a58._6_2_ = (short)((ulong)local_a68 >> 0x30);
    uStack_a50._0_2_ = (short)uStack_a60;
    uStack_a50._2_2_ = (short)((ulong)uStack_a60 >> 0x10);
    uStack_a50._4_2_ = (short)((ulong)uStack_a60 >> 0x20);
    uStack_a50._6_2_ = (short)((ulong)uStack_a60 >> 0x30);
    local_1748 = (short)local_a58 * 2;
    sStack_1746 = local_a58._2_2_ * 2;
    sStack_1744 = local_a58._4_2_ * 2;
    sStack_1742 = local_a58._6_2_ * 2;
    sStack_1740 = (short)uStack_a50 * 2;
    sStack_173e = uStack_a50._2_2_ * 2;
    sStack_173c = uStack_a50._4_2_ * 2;
    sStack_173a = uStack_a50._6_2_ * 2;
    uVar1 = local_1470[10];
    uVar2 = local_1470[0xb];
    local_6e8 = (short)uVar1;
    sStack_6e6 = (short)((ulong)uVar1 >> 0x10);
    sStack_6e4 = (short)((ulong)uVar1 >> 0x20);
    sStack_6e2 = (short)((ulong)uVar1 >> 0x30);
    sStack_6e0 = (short)uVar2;
    sStack_6de = (short)((ulong)uVar2 >> 0x10);
    sStack_6dc = (short)((ulong)uVar2 >> 0x20);
    sStack_6da = (short)((ulong)uVar2 >> 0x30);
    local_6e8 = local_17a8 - local_6e8;
    sStack_6e6 = sStack_17a6 - sStack_6e6;
    sStack_6e4 = sStack_17a4 - sStack_6e4;
    sStack_6e2 = sStack_17a2 - sStack_6e2;
    sStack_16b0 = sStack_17a0 - sStack_6e0;
    sStack_16ae = sStack_179e - sStack_6de;
    sStack_16ac = sStack_179c - sStack_6dc;
    sStack_16aa = sStack_179a - sStack_6da;
    local_17e8._0_4_ = CONCAT22(sStack_6e6,local_6e8);
    local_17e8._0_6_ = CONCAT24(sStack_6e4,(undefined4)local_17e8);
    local_17e8 = CONCAT26(sStack_6e2,(undefined6)local_17e8);
    uStack_17e0._0_4_ = CONCAT22(sStack_16ae,sStack_16b0);
    uStack_17e0._0_6_ = CONCAT24(sStack_16ac,(undefined4)uStack_17e0);
    uStack_17e0 = CONCAT26(sStack_16aa,(undefined6)uStack_17e0);
    uVar1 = local_1468[10];
    uVar2 = local_1468[0xb];
    local_708 = (short)uVar1;
    sStack_706 = (short)((ulong)uVar1 >> 0x10);
    sStack_704 = (short)((ulong)uVar1 >> 0x20);
    sStack_702 = (short)((ulong)uVar1 >> 0x30);
    sStack_700 = (short)uVar2;
    sStack_6fe = (short)((ulong)uVar2 >> 0x10);
    sStack_6fc = (short)((ulong)uVar2 >> 0x20);
    sStack_6fa = (short)((ulong)uVar2 >> 0x30);
    local_17b8 = local_17a8 - local_708;
    sStack_17b6 = sStack_17a6 - sStack_706;
    sStack_17b4 = sStack_17a4 - sStack_704;
    sStack_17b2 = sStack_17a2 - sStack_702;
    sStack_17b0 = sStack_17a0 - sStack_700;
    sStack_17ae = sStack_179e - sStack_6fe;
    sStack_17ac = sStack_179c - sStack_6fc;
    sStack_17aa = sStack_179a - sStack_6fa;
    uVar1 = *local_1470;
    uVar2 = local_1470[1];
    uVar3 = local_1470[0xc];
    uVar4 = local_1470[0xd];
    local_a78 = uVar3;
    uStack_a70 = uVar4;
    local_a88 = uVar1;
    uStack_a80 = uVar2;
    local_a78._0_2_ = (short)uVar3;
    local_a78._2_2_ = (short)((ulong)uVar3 >> 0x10);
    local_a78._4_2_ = (short)((ulong)uVar3 >> 0x20);
    local_a78._6_2_ = (short)((ulong)uVar3 >> 0x30);
    uStack_a70._0_2_ = (short)uVar4;
    uStack_a70._2_2_ = (short)((ulong)uVar4 >> 0x10);
    uStack_a70._4_2_ = (short)((ulong)uVar4 >> 0x20);
    uStack_a70._6_2_ = (short)((ulong)uVar4 >> 0x30);
    local_a88._0_2_ = (short)uVar1;
    local_a88._2_2_ = (short)((ulong)uVar1 >> 0x10);
    local_a88._4_2_ = (short)((ulong)uVar1 >> 0x20);
    local_a88._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_a80._0_2_ = (short)uVar2;
    uStack_a80._2_2_ = (short)((ulong)uVar2 >> 0x10);
    uStack_a80._4_2_ = (short)((ulong)uVar2 >> 0x20);
    uStack_a80._6_2_ = (short)((ulong)uVar2 >> 0x30);
    uVar1 = local_1470[2];
    uVar2 = local_1470[3];
    local_a98 = (short)local_a78 + (short)local_a88;
    sStack_a96 = local_a78._2_2_ + local_a88._2_2_;
    sStack_a94 = local_a78._4_2_ + local_a88._4_2_;
    sStack_a92 = local_a78._6_2_ + local_a88._6_2_;
    sStack_a90 = (short)uStack_a70 + (short)uStack_a80;
    sStack_a8e = uStack_a70._2_2_ + uStack_a80._2_2_;
    sStack_a8c = uStack_a70._4_2_ + uStack_a80._4_2_;
    sStack_a8a = uStack_a70._6_2_ + uStack_a80._6_2_;
    local_aa8 = uVar1;
    uStack_aa0 = uVar2;
    local_aa8._0_2_ = (short)uVar1;
    local_aa8._2_2_ = (short)((ulong)uVar1 >> 0x10);
    local_aa8._4_2_ = (short)((ulong)uVar1 >> 0x20);
    local_aa8._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_aa0._0_2_ = (short)uVar2;
    uStack_aa0._2_2_ = (short)((ulong)uVar2 >> 0x10);
    uStack_aa0._4_2_ = (short)((ulong)uVar2 >> 0x20);
    uStack_aa0._6_2_ = (short)((ulong)uVar2 >> 0x30);
    local_1788 = (short)local_a78 + (short)local_a88 + (short)local_aa8;
    sStack_1786 = local_a78._2_2_ + local_a88._2_2_ + local_aa8._2_2_;
    sStack_1784 = local_a78._4_2_ + local_a88._4_2_ + local_aa8._4_2_;
    sStack_1782 = local_a78._6_2_ + local_a88._6_2_ + local_aa8._6_2_;
    sStack_1780 = (short)uStack_a70 + (short)uStack_a80 + (short)uStack_aa0;
    sStack_177e = uStack_a70._2_2_ + uStack_a80._2_2_ + uStack_aa0._2_2_;
    sStack_177c = uStack_a70._4_2_ + uStack_a80._4_2_ + uStack_aa0._4_2_;
    sStack_177a = uStack_a70._6_2_ + uStack_a80._6_2_ + uStack_aa0._6_2_;
    uVar1 = *local_1470;
    uVar2 = local_1470[1];
    uVar3 = local_1470[2];
    uVar4 = local_1470[3];
    uVar5 = local_1470[4];
    uVar6 = local_1470[5];
    local_ab8 = uVar5;
    uStack_ab0 = uVar6;
    local_ac8 = uVar1;
    uStack_ac0 = uVar2;
    local_ab8._0_2_ = (short)uVar5;
    local_ab8._2_2_ = (short)((ulong)uVar5 >> 0x10);
    local_ab8._4_2_ = (short)((ulong)uVar5 >> 0x20);
    local_ab8._6_2_ = (short)((ulong)uVar5 >> 0x30);
    uStack_ab0._0_2_ = (short)uVar6;
    uStack_ab0._2_2_ = (short)((ulong)uVar6 >> 0x10);
    uStack_ab0._4_2_ = (short)((ulong)uVar6 >> 0x20);
    uStack_ab0._6_2_ = (short)((ulong)uVar6 >> 0x30);
    local_ac8._0_2_ = (short)uVar1;
    local_ac8._2_2_ = (short)((ulong)uVar1 >> 0x10);
    local_ac8._4_2_ = (short)((ulong)uVar1 >> 0x20);
    local_ac8._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_ac0._0_2_ = (short)uVar2;
    uStack_ac0._2_2_ = (short)((ulong)uVar2 >> 0x10);
    uStack_ac0._4_2_ = (short)((ulong)uVar2 >> 0x20);
    uStack_ac0._6_2_ = (short)((ulong)uVar2 >> 0x30);
    local_ad8 = uVar3;
    uStack_ad0 = uVar4;
    local_ae8 = (short)local_ab8 + (short)local_ac8;
    sStack_ae6 = local_ab8._2_2_ + local_ac8._2_2_;
    sStack_ae4 = local_ab8._4_2_ + local_ac8._4_2_;
    sStack_ae2 = local_ab8._6_2_ + local_ac8._6_2_;
    sStack_ae0 = (short)uStack_ab0 + (short)uStack_ac0;
    sStack_ade = uStack_ab0._2_2_ + uStack_ac0._2_2_;
    sStack_adc = uStack_ab0._4_2_ + uStack_ac0._4_2_;
    sStack_ada = uStack_ab0._6_2_ + uStack_ac0._6_2_;
    local_ad8._0_2_ = (short)uVar3;
    local_ad8._2_2_ = (short)((ulong)uVar3 >> 0x10);
    local_ad8._4_2_ = (short)((ulong)uVar3 >> 0x20);
    local_ad8._6_2_ = (short)((ulong)uVar3 >> 0x30);
    uStack_ad0._0_2_ = (short)uVar4;
    uStack_ad0._2_2_ = (short)((ulong)uVar4 >> 0x10);
    uStack_ad0._4_2_ = (short)((ulong)uVar4 >> 0x20);
    uStack_ad0._6_2_ = (short)((ulong)uVar4 >> 0x30);
    local_b08 = (short)local_ad8 + (short)local_ab8 + (short)local_ac8;
    sStack_b06 = local_ad8._2_2_ + local_ab8._2_2_ + local_ac8._2_2_;
    sStack_b04 = local_ad8._4_2_ + local_ab8._4_2_ + local_ac8._4_2_;
    sStack_b02 = local_ad8._6_2_ + local_ab8._6_2_ + local_ac8._6_2_;
    sStack_b00 = (short)uStack_ad0 + (short)uStack_ab0 + (short)uStack_ac0;
    sStack_afe = uStack_ad0._2_2_ + uStack_ab0._2_2_ + uStack_ac0._2_2_;
    sStack_afc = uStack_ad0._4_2_ + uStack_ab0._4_2_ + uStack_ac0._4_2_;
    sStack_afa = uStack_ad0._6_2_ + uStack_ab0._6_2_ + uStack_ac0._6_2_;
    local_af8 = CONCAT26(sStack_1732,CONCAT24(sStack_1734,CONCAT22(sStack_1736,local_1738)));
    uStack_af0 = CONCAT26(sStack_172a,CONCAT24(sStack_172c,CONCAT22(sStack_172e,sStack_1730)));
    local_1798 = local_1738 + local_b08;
    sStack_1796 = sStack_1736 + sStack_b06;
    sStack_1794 = sStack_1734 + sStack_b04;
    sStack_1792 = sStack_1732 + sStack_b02;
    sStack_1790 = sStack_1730 + sStack_b00;
    sStack_178e = sStack_172e + sStack_afe;
    sStack_178c = sStack_172c + sStack_afc;
    sStack_178a = sStack_172a + sStack_afa;
    uVar1 = local_1470[4];
    uVar2 = local_1470[5];
    local_728 = (short)uVar1;
    sStack_726 = (short)((ulong)uVar1 >> 0x10);
    sStack_724 = (short)((ulong)uVar1 >> 0x20);
    sStack_722 = (short)((ulong)uVar1 >> 0x30);
    sStack_720 = (short)uVar2;
    sStack_71e = (short)((ulong)uVar2 >> 0x10);
    sStack_71c = (short)((ulong)uVar2 >> 0x20);
    sStack_71a = (short)((ulong)uVar2 >> 0x30);
    local_728 = local_17c8 - local_728;
    sStack_726 = sStack_17c6 - sStack_726;
    sStack_724 = sStack_17c4 - sStack_724;
    sStack_722 = sStack_17c2 - sStack_722;
    sStack_15c0 = sStack_9a0 - sStack_720;
    sStack_15be = sStack_99e - sStack_71e;
    sStack_15bc = sStack_99c - sStack_71c;
    sStack_15ba = sStack_99a - sStack_71a;
    local_17d8._0_4_ = CONCAT22(sStack_726,local_728);
    local_17d8._0_6_ = CONCAT24(sStack_724,(undefined4)local_17d8);
    local_17d8 = CONCAT26(sStack_722,(undefined6)local_17d8);
    uStack_17d0._0_4_ = CONCAT22(sStack_15be,sStack_15c0);
    uStack_17d0._0_6_ = CONCAT24(sStack_15bc,(undefined4)uStack_17d0);
    uStack_17d0 = CONCAT26(sStack_15ba,(undefined6)uStack_17d0);
    uVar1 = local_1468[4];
    uVar2 = local_1468[5];
    local_748 = (short)uVar1;
    sStack_746 = (short)((ulong)uVar1 >> 0x10);
    sStack_744 = (short)((ulong)uVar1 >> 0x20);
    sStack_742 = (short)((ulong)uVar1 >> 0x30);
    sStack_740 = (short)uVar2;
    sStack_73e = (short)((ulong)uVar2 >> 0x10);
    sStack_73c = (short)((ulong)uVar2 >> 0x20);
    sStack_73a = (short)((ulong)uVar2 >> 0x30);
    local_17c8 = local_17c8 - local_748;
    sStack_17c6 = sStack_17c6 - sStack_746;
    sStack_17c4 = sStack_17c4 - sStack_744;
    sStack_17c2 = sStack_17c2 - sStack_742;
    sStack_9a0 = sStack_9a0 - sStack_740;
    sStack_99e = sStack_99e - sStack_73e;
    sStack_99c = sStack_99c - sStack_73c;
    sStack_99a = sStack_99a - sStack_73a;
    uVar1 = local_1470[2];
    uVar2 = local_1470[3];
    local_b18 = CONCAT26(sStack_1742,CONCAT24(sStack_1744,CONCAT22(sStack_1746,local_1748)));
    uStack_b10 = CONCAT26(sStack_173a,CONCAT24(sStack_173c,CONCAT22(sStack_173e,sStack_1740)));
    local_b28 = uVar1;
    uStack_b20 = uVar2;
    local_b28._0_2_ = (short)uVar1;
    local_b28._2_2_ = (short)((ulong)uVar1 >> 0x10);
    local_b28._4_2_ = (short)((ulong)uVar1 >> 0x20);
    local_b28._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_b20._0_2_ = (short)uVar2;
    uStack_b20._2_2_ = (short)((ulong)uVar2 >> 0x10);
    uStack_b20._4_2_ = (short)((ulong)uVar2 >> 0x20);
    uStack_b20._6_2_ = (short)((ulong)uVar2 >> 0x30);
    uStack_b20._0_2_ = sStack_1740 + (short)uStack_b20;
    uStack_b20._2_2_ = sStack_173e + uStack_b20._2_2_;
    uStack_b20._4_2_ = sStack_173c + uStack_b20._4_2_;
    uStack_b20._6_2_ = sStack_173a + uStack_b20._6_2_;
    local_b38 = CONCAT26(sStack_17c2,CONCAT24(sStack_17c4,CONCAT22(sStack_17c6,local_17c8)));
    uStack_b30 = CONCAT26(sStack_99a,CONCAT24(sStack_99c,CONCAT22(sStack_99e,sStack_9a0)));
    local_b48 = CONCAT26(sStack_1742 + local_b28._6_2_,
                         CONCAT24(sStack_1744 + local_b28._4_2_,
                                  CONCAT22(sStack_1746 + local_b28._2_2_,
                                           local_1748 + (short)local_b28)));
    uStack_b40 = CONCAT26(uStack_b20._6_2_,
                          CONCAT24(uStack_b20._4_2_,CONCAT22(uStack_b20._2_2_,(short)uStack_b20)));
    local_1598 = local_17c8 + local_1748 + (short)local_b28;
    uStack_1596 = sStack_17c6 + sStack_1746 + local_b28._2_2_;
    uStack_1594 = sStack_17c4 + sStack_1744 + local_b28._4_2_;
    uStack_1592 = sStack_17c2 + sStack_1742 + local_b28._6_2_;
    sStack_1590 = sStack_9a0 + (short)uStack_b20;
    sStack_158e = sStack_99e + uStack_b20._2_2_;
    sStack_158c = sStack_99c + uStack_b20._4_2_;
    sStack_158a = sStack_99a + uStack_b20._6_2_;
    local_b58 = local_17d8;
    uStack_b50 = uStack_17d0;
    local_b68 = CONCAT26(uStack_b20._6_2_,
                         CONCAT24(uStack_b20._4_2_,CONCAT22(uStack_b20._2_2_,(short)uStack_b20)));
    uStack_b60 = 0;
    local_15c8 = local_728 + (short)uStack_b20;
    uStack_15c6 = sStack_726 + uStack_b20._2_2_;
    uStack_15c4 = sStack_724 + uStack_b20._4_2_;
    uStack_15c2 = sStack_722 + uStack_b20._6_2_;
    local_12b8 = CONCAT26(uStack_15a2,CONCAT24(uStack_15a4,CONCAT22(uStack_15a6,local_15a8)));
    uStack_12b0 = CONCAT26(sStack_159a,CONCAT24(sStack_159c,CONCAT22(sStack_159e,sStack_15a0)));
    local_12c8 = CONCAT26(uStack_15d2,CONCAT24(uStack_15d4,CONCAT22(uStack_15d6,local_15d8)));
    uStack_12c0 = CONCAT26(sStack_15ca,CONCAT24(sStack_15cc,CONCAT22(sStack_15ce,sStack_15d0)));
    local_1608._0_2_ = local_15a8 >> 3;
    local_1608._2_2_ = uStack_15a6 >> 3;
    local_1608._4_2_ = uStack_15a4 >> 3;
    local_1608._6_2_ = uStack_15a2 >> 3;
    uStack_1600._0_2_ = local_15d8 >> 3;
    uStack_1600._2_2_ = uStack_15d6 >> 3;
    uStack_1600._4_2_ = uStack_15d4 >> 3;
    uStack_1600._6_2_ = uStack_15d2 >> 3;
    local_12d8 = CONCAT26(uStack_1592,CONCAT24(uStack_1594,CONCAT22(uStack_1596,local_1598)));
    uStack_12d0 = CONCAT26(sStack_99a + uStack_b20._6_2_,
                           CONCAT24(sStack_99c + uStack_b20._4_2_,
                                    CONCAT22(sStack_99e + uStack_b20._2_2_,
                                             sStack_9a0 + (short)uStack_b20)));
    local_12e8 = CONCAT26(uStack_15c2,CONCAT24(uStack_15c4,CONCAT22(uStack_15c6,local_15c8)));
    uStack_12e0 = CONCAT26(sStack_15ba,CONCAT24(sStack_15bc,CONCAT22(sStack_15be,sStack_15c0)));
    local_15f8 = local_1598 >> 3;
    uStack_15f6 = uStack_1596 >> 3;
    uStack_15f4 = uStack_1594 >> 3;
    uStack_15f2 = uStack_1592 >> 3;
    uStack_15f0 = local_15c8 >> 3;
    uStack_15ee = uStack_15c6 >> 3;
    uStack_15ec = uStack_15c4 >> 3;
    uStack_15ea = uStack_15c2 >> 3;
    uVar1 = local_1468[2];
    uVar2 = local_1468[3];
    local_768 = (short)uVar1;
    sStack_766 = (short)((ulong)uVar1 >> 0x10);
    sStack_764 = (short)((ulong)uVar1 >> 0x20);
    sStack_762 = (short)((ulong)uVar1 >> 0x30);
    sStack_760 = (short)uVar2;
    sStack_75e = (short)((ulong)uVar2 >> 0x10);
    sStack_75c = (short)((ulong)uVar2 >> 0x20);
    sStack_75a = (short)((ulong)uVar2 >> 0x30);
    local_17c8 = local_17c8 - local_768;
    sStack_17c6 = sStack_17c6 - sStack_766;
    sStack_17c4 = sStack_17c4 - sStack_764;
    sStack_17c2 = sStack_17c2 - sStack_762;
    sStack_17c0 = sStack_9a0 - sStack_760;
    sStack_17be = sStack_99e - sStack_75e;
    sStack_17bc = sStack_99c - sStack_75c;
    sStack_17ba = sStack_99a - sStack_75a;
    uVar1 = local_1470[2];
    uVar2 = local_1470[3];
    local_788 = (short)uVar1;
    sStack_786 = (short)((ulong)uVar1 >> 0x10);
    sStack_784 = (short)((ulong)uVar1 >> 0x20);
    sStack_782 = (short)((ulong)uVar1 >> 0x30);
    sStack_780 = (short)uVar2;
    sStack_77e = (short)((ulong)uVar2 >> 0x10);
    sStack_77c = (short)((ulong)uVar2 >> 0x20);
    sStack_77a = (short)((ulong)uVar2 >> 0x30);
    sStack_15b0 = sStack_15c0 - sStack_780;
    sStack_15ae = sStack_15be - sStack_77e;
    sStack_15ac = sStack_15bc - sStack_77c;
    sStack_15aa = sStack_15ba - sStack_77a;
    local_17d8._0_4_ = CONCAT22(sStack_726 - sStack_786,local_728 - local_788);
    local_17d8._0_6_ = CONCAT24(sStack_724 - sStack_784,(undefined4)local_17d8);
    local_17d8 = CONCAT26(sStack_722 - sStack_782,(undefined6)local_17d8);
    uStack_17d0._0_4_ = CONCAT22(sStack_15ae,sStack_15b0);
    uStack_17d0._0_6_ = CONCAT24(sStack_15ac,(undefined4)uStack_17d0);
    uStack_17d0 = CONCAT26(sStack_15aa,(undefined6)uStack_17d0);
    uVar1 = local_1470[6];
    uVar2 = local_1470[7];
    local_b78 = CONCAT26(sStack_1742,CONCAT24(sStack_1744,CONCAT22(sStack_1746,local_1748)));
    uStack_b70 = CONCAT26(sStack_173a,CONCAT24(sStack_173c,CONCAT22(sStack_173e,sStack_1740)));
    local_b88 = uVar1;
    uStack_b80 = uVar2;
    local_b88._0_2_ = (short)uVar1;
    local_b88._2_2_ = (short)((ulong)uVar1 >> 0x10);
    local_b88._4_2_ = (short)((ulong)uVar1 >> 0x20);
    local_b88._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_b80._0_2_ = (short)uVar2;
    uStack_b80._2_2_ = (short)((ulong)uVar2 >> 0x10);
    uStack_b80._4_2_ = (short)((ulong)uVar2 >> 0x20);
    uStack_b80._6_2_ = (short)((ulong)uVar2 >> 0x30);
    local_1748 = local_1748 + (short)local_b88;
    sStack_1746 = sStack_1746 + local_b88._2_2_;
    sStack_1744 = sStack_1744 + local_b88._4_2_;
    sStack_1742 = sStack_1742 + local_b88._6_2_;
    sStack_1740 = sStack_1740 + (short)uStack_b80;
    sStack_173e = sStack_173e + uStack_b80._2_2_;
    sStack_173c = sStack_173c + uStack_b80._4_2_;
    sStack_173a = sStack_173a + uStack_b80._6_2_;
    uVar1 = local_1470[4];
    uVar2 = local_1470[5];
    local_b98 = CONCAT26(sStack_1742,CONCAT24(sStack_1744,CONCAT22(sStack_1746,local_1748)));
    uStack_b90 = CONCAT26(sStack_173a,CONCAT24(sStack_173c,CONCAT22(sStack_173e,sStack_1740)));
    local_ba8 = uVar1;
    uStack_ba0 = uVar2;
    local_ba8._0_2_ = (short)uVar1;
    local_ba8._2_2_ = (short)((ulong)uVar1 >> 0x10);
    local_ba8._4_2_ = (short)((ulong)uVar1 >> 0x20);
    local_ba8._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_ba0._0_2_ = (short)uVar2;
    uStack_ba0._2_2_ = (short)((ulong)uVar2 >> 0x10);
    uStack_ba0._4_2_ = (short)((ulong)uVar2 >> 0x20);
    uStack_ba0._6_2_ = (short)((ulong)uVar2 >> 0x30);
    local_1778 = local_1748 + (short)local_ba8;
    sStack_1776 = sStack_1746 + local_ba8._2_2_;
    sStack_1774 = sStack_1744 + local_ba8._4_2_;
    sStack_1772 = sStack_1742 + local_ba8._6_2_;
    sStack_1770 = sStack_1740 + (short)uStack_ba0;
    sStack_176e = sStack_173e + uStack_ba0._2_2_;
    sStack_176c = sStack_173c + uStack_ba0._4_2_;
    sStack_176a = sStack_173a + uStack_ba0._6_2_;
    local_bb8 = CONCAT26(sStack_17c2,CONCAT24(sStack_17c4,CONCAT22(sStack_17c6,local_17c8)));
    uStack_bb0 = CONCAT26(sStack_17ba,CONCAT24(sStack_17bc,CONCAT22(sStack_17be,sStack_17c0)));
    local_bc8 = CONCAT26(sStack_1772,CONCAT24(sStack_1774,CONCAT22(sStack_1776,local_1778)));
    uStack_bc0 = CONCAT26(sStack_176a,CONCAT24(sStack_176c,CONCAT22(sStack_176e,sStack_1770)));
    local_1588 = local_17c8 + local_1778;
    uStack_1586 = sStack_17c6 + sStack_1776;
    uStack_1584 = sStack_17c4 + sStack_1774;
    uStack_1582 = sStack_17c2 + sStack_1772;
    sStack_1580 = sStack_17c0 + sStack_1770;
    sStack_157e = sStack_17be + sStack_176e;
    sStack_157c = sStack_17bc + sStack_176c;
    sStack_157a = sStack_17ba + sStack_176a;
    local_bd8 = local_17d8;
    uStack_bd0 = uStack_17d0;
    local_be8 = CONCAT26(sStack_176a,CONCAT24(sStack_176c,CONCAT22(sStack_176e,sStack_1770)));
    uStack_be0 = 0;
    local_15b8 = (local_728 - local_788) + sStack_1770;
    uStack_15b6 = (sStack_726 - sStack_786) + sStack_176e;
    uStack_15b4 = (sStack_724 - sStack_784) + sStack_176c;
    uStack_15b2 = (sStack_722 - sStack_782) + sStack_176a;
    local_12f8 = CONCAT26(uStack_1582,CONCAT24(uStack_1584,CONCAT22(uStack_1586,local_1588)));
    uStack_12f0 = CONCAT26(sStack_17ba + sStack_176a,
                           CONCAT24(sStack_17bc + sStack_176c,
                                    CONCAT22(sStack_17be + sStack_176e,sStack_17c0 + sStack_1770)));
    local_1308 = CONCAT26(uStack_15b2,CONCAT24(uStack_15b4,CONCAT22(uStack_15b6,local_15b8)));
    uStack_1300 = CONCAT26(sStack_15aa,CONCAT24(sStack_15ac,CONCAT22(sStack_15ae,sStack_15b0)));
    local_15e8 = local_1588 >> 3;
    uStack_15e6 = uStack_1586 >> 3;
    uStack_15e4 = uStack_1584 >> 3;
    uStack_15e2 = uStack_1582 >> 3;
    uStack_15e0 = local_15b8 >> 3;
    uStack_15de = uStack_15b6 >> 3;
    uStack_15dc = uStack_15b4 >> 3;
    uStack_15da = uStack_15b2 >> 3;
    local_fe8 = local_1278;
    uStack_fe0 = local_1278;
    local_ff8 = local_14a8;
    uStack_ff0 = uStack_14a0;
    local_fe8._0_2_ = (short)local_1278;
    local_fe8._2_2_ = (short)(local_1278 >> 0x10);
    local_fe8._4_2_ = (short)(local_1278 >> 0x20);
    local_fe8._6_2_ = (short)(local_1278 >> 0x30);
    uStack_100a = -(ushort)(local_fe8._6_2_ == uStack_fd0._6_2_);
    local_1018 = -(ushort)((short)local_fe8 == (short)local_fd8);
    sStack_1016 = -(ushort)(local_fe8._2_2_ == local_fd8._2_2_);
    sStack_1014 = -(ushort)(local_fe8._4_2_ == local_fd8._4_2_);
    sStack_1012 = -(ushort)(local_fe8._6_2_ == local_fd8._6_2_);
    sStack_1010 = -(ushort)((short)local_fe8 == (short)uStack_fd0);
    sStack_100e = -(ushort)(local_fe8._2_2_ == uStack_fd0._2_2_);
    sStack_100c = -(ushort)(local_fe8._4_2_ == uStack_fd0._4_2_);
    auVar27._2_2_ = -(ushort)(local_fe8._2_2_ == local_fd8._2_2_);
    auVar27._0_2_ = -(ushort)((short)local_fe8 == (short)local_fd8);
    auVar27._4_2_ = -(ushort)(local_fe8._4_2_ == local_fd8._4_2_);
    auVar27._6_2_ = -(ushort)(local_fe8._6_2_ == local_fd8._6_2_);
    auVar27._8_2_ = -(ushort)((short)local_fe8 == (short)uStack_fd0);
    auVar27._10_2_ = -(ushort)(local_fe8._2_2_ == uStack_fd0._2_2_);
    auVar27._12_2_ = -(ushort)(local_fe8._4_2_ == uStack_fd0._4_2_);
    auVar27._14_2_ = uStack_100a;
    local_17ec = (uint)((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)((byte)(uStack_100a >> 7) & 1) << 0xe |
                                uStack_100a & 0x8000) != 0xffff);
    if (local_17ec != 0) {
      uVar1 = *local_1468;
      uVar2 = local_1468[1];
      local_bf8 = CONCAT26(sStack_1782,CONCAT24(sStack_1784,CONCAT22(sStack_1786,local_1788)));
      uStack_bf0 = CONCAT26(sStack_177a,CONCAT24(sStack_177c,CONCAT22(sStack_177e,sStack_1780)));
      local_c08 = uVar1;
      uStack_c00 = uVar2;
      local_c08._0_2_ = (short)uVar1;
      local_c08._2_2_ = (short)((ulong)uVar1 >> 0x10);
      local_c08._4_2_ = (short)((ulong)uVar1 >> 0x20);
      local_c08._6_2_ = (short)((ulong)uVar1 >> 0x30);
      uStack_c00._0_2_ = (short)uVar2;
      uStack_c00._2_2_ = (short)((ulong)uVar2 >> 0x10);
      uStack_c00._4_2_ = (short)((ulong)uVar2 >> 0x20);
      uStack_c00._6_2_ = (short)((ulong)uVar2 >> 0x30);
      local_c18 = CONCAT26(sStack_17a2,CONCAT24(sStack_17a4,CONCAT22(sStack_17a6,local_17a8)));
      uStack_c10 = CONCAT26(sStack_179a,CONCAT24(sStack_179c,CONCAT22(sStack_179e,sStack_17a0)));
      local_c28 = local_1788 + (short)local_c08;
      sStack_c26 = sStack_1786 + local_c08._2_2_;
      sStack_c24 = sStack_1784 + local_c08._4_2_;
      sStack_c22 = sStack_1782 + local_c08._6_2_;
      sStack_c20 = sStack_1780 + (short)uStack_c00;
      sStack_c1e = sStack_177e + uStack_c00._2_2_;
      sStack_c1c = sStack_177c + uStack_c00._4_2_;
      sStack_c1a = sStack_177a + uStack_c00._6_2_;
      local_1668 = local_17a8 + local_1788 + (short)local_c08;
      uStack_1666 = sStack_17a6 + sStack_1786 + local_c08._2_2_;
      uStack_1664 = sStack_17a4 + sStack_1784 + local_c08._4_2_;
      uStack_1662 = sStack_17a2 + sStack_1782 + local_c08._6_2_;
      sStack_1660 = sStack_17a0 + sStack_1780 + (short)uStack_c00;
      sStack_165e = sStack_179e + sStack_177e + uStack_c00._2_2_;
      sStack_165c = sStack_179c + sStack_177c + uStack_c00._4_2_;
      sStack_165a = sStack_179a + sStack_177a + uStack_c00._6_2_;
      uVar1 = *local_1470;
      uVar2 = local_1470[1];
      local_c38 = CONCAT26(sStack_177a,CONCAT24(sStack_177c,CONCAT22(sStack_177e,sStack_1780)));
      uStack_c30 = 0;
      local_c48 = uVar1;
      uStack_c40 = uVar2;
      local_c48._0_2_ = (short)uVar1;
      local_c48._2_2_ = (short)((ulong)uVar1 >> 0x10);
      local_c48._4_2_ = (short)((ulong)uVar1 >> 0x20);
      local_c48._6_2_ = (short)((ulong)uVar1 >> 0x30);
      uStack_c40._0_2_ = (short)uVar2;
      uStack_c40._2_2_ = (short)((ulong)uVar2 >> 0x10);
      uStack_c40._4_2_ = (short)((ulong)uVar2 >> 0x20);
      uStack_c40._6_2_ = (short)((ulong)uVar2 >> 0x30);
      local_c58 = CONCAT26(sStack_17a2,CONCAT24(sStack_17a4,CONCAT22(sStack_17a6,local_17a8)));
      uStack_c50 = CONCAT26(sStack_179a,CONCAT24(sStack_179c,CONCAT22(sStack_179e,sStack_17a0)));
      local_c68 = sStack_1780 + (short)local_c48;
      sStack_c66 = sStack_177e + local_c48._2_2_;
      sStack_c64 = sStack_177c + local_c48._4_2_;
      sStack_c62 = sStack_177a + local_c48._6_2_;
      sStack_c60 = (short)uStack_c40;
      sStack_c5e = uStack_c40._2_2_;
      sStack_c5c = uStack_c40._4_2_;
      sStack_c5a = uStack_c40._6_2_;
      local_16c8 = local_17a8 + sStack_1780 + (short)local_c48;
      uStack_16c6 = sStack_17a6 + sStack_177e + local_c48._2_2_;
      uStack_16c4 = sStack_17a4 + sStack_177c + local_c48._4_2_;
      uStack_16c2 = sStack_17a2 + sStack_177a + local_c48._6_2_;
      sStack_16c0 = sStack_17a0 + (short)uStack_c40;
      sStack_16be = sStack_179e + uStack_c40._2_2_;
      sStack_16bc = sStack_179c + uStack_c40._4_2_;
      sStack_16ba = sStack_179a + uStack_c40._6_2_;
      local_c78 = CONCAT26(sStack_17b2,CONCAT24(sStack_17b4,CONCAT22(sStack_17b6,local_17b8)));
      uStack_c70 = CONCAT26(sStack_17aa,CONCAT24(sStack_17ac,CONCAT22(sStack_17ae,sStack_17b0)));
      local_c88 = CONCAT26(sStack_1792,CONCAT24(sStack_1794,CONCAT22(sStack_1796,local_1798)));
      uStack_c80 = CONCAT26(sStack_178a,CONCAT24(sStack_178c,CONCAT22(sStack_178e,sStack_1790)));
      local_1658 = local_17b8 + local_1798;
      uStack_1656 = sStack_17b6 + sStack_1796;
      uStack_1654 = sStack_17b4 + sStack_1794;
      uStack_1652 = sStack_17b2 + sStack_1792;
      sStack_1650 = sStack_17b0 + sStack_1790;
      sStack_164e = sStack_17ae + sStack_178e;
      sStack_164c = sStack_17ac + sStack_178c;
      sStack_164a = sStack_17aa + sStack_178a;
      local_c98 = local_17e8;
      uStack_c90 = uStack_17e0;
      local_ca8 = CONCAT26(sStack_178a,CONCAT24(sStack_178c,CONCAT22(sStack_178e,sStack_1790)));
      uStack_ca0 = 0;
      local_16b8 = local_6e8 + sStack_1790;
      uStack_16b6 = sStack_6e6 + sStack_178e;
      uStack_16b4 = sStack_6e4 + sStack_178c;
      uStack_16b2 = sStack_6e2 + sStack_178a;
      local_1338 = CONCAT26(uStack_1662,CONCAT24(uStack_1664,CONCAT22(uStack_1666,local_1668)));
      uStack_1330 = CONCAT26(sStack_165a,CONCAT24(sStack_165c,CONCAT22(sStack_165e,sStack_1660)));
      local_1348 = CONCAT26(uStack_16c2,CONCAT24(uStack_16c4,CONCAT22(uStack_16c6,local_16c8)));
      uStack_1340 = CONCAT26(sStack_179a + uStack_c40._6_2_,
                             CONCAT24(sStack_179c + uStack_c40._4_2_,
                                      CONCAT22(sStack_179e + uStack_c40._2_2_,
                                               sStack_17a0 + (short)uStack_c40)));
      local_1728._0_2_ = local_1668 >> 4;
      local_1728._2_2_ = uStack_1666 >> 4;
      local_1728._4_2_ = uStack_1664 >> 4;
      local_1728._6_2_ = uStack_1662 >> 4;
      uStack_1720._0_2_ = local_16c8 >> 4;
      uStack_1720._2_2_ = uStack_16c6 >> 4;
      uStack_1720._4_2_ = uStack_16c4 >> 4;
      uStack_1720._6_2_ = uStack_16c2 >> 4;
      local_1358 = CONCAT26(uStack_1652,CONCAT24(uStack_1654,CONCAT22(uStack_1656,local_1658)));
      uStack_1350 = CONCAT26(sStack_17aa + sStack_178a,
                             CONCAT24(sStack_17ac + sStack_178c,
                                      CONCAT22(sStack_17ae + sStack_178e,sStack_17b0 + sStack_1790))
                            );
      local_1368 = CONCAT26(uStack_16b2,CONCAT24(uStack_16b4,CONCAT22(uStack_16b6,local_16b8)));
      uStack_1360 = CONCAT26(sStack_16aa,CONCAT24(sStack_16ac,CONCAT22(sStack_16ae,sStack_16b0)));
      local_1718 = local_1658 >> 4;
      uStack_1716 = uStack_1656 >> 4;
      uStack_1714 = uStack_1654 >> 4;
      uStack_1712 = uStack_1652 >> 4;
      uStack_1710 = local_16b8 >> 4;
      uStack_170e = uStack_16b6 >> 4;
      uStack_170c = uStack_16b4 >> 4;
      uStack_170a = uStack_16b2 >> 4;
      uVar1 = local_1468[8];
      uVar2 = local_1468[9];
      local_7a8 = (short)uVar1;
      sStack_7a6 = (short)((ulong)uVar1 >> 0x10);
      sStack_7a4 = (short)((ulong)uVar1 >> 0x20);
      sStack_7a2 = (short)((ulong)uVar1 >> 0x30);
      sStack_7a0 = (short)uVar2;
      sStack_79e = (short)((ulong)uVar2 >> 0x10);
      sStack_79c = (short)((ulong)uVar2 >> 0x20);
      sStack_79a = (short)((ulong)uVar2 >> 0x30);
      local_17b8 = local_17b8 - local_7a8;
      sStack_17b6 = sStack_17b6 - sStack_7a6;
      sStack_17b4 = sStack_17b4 - sStack_7a4;
      sStack_17b2 = sStack_17b2 - sStack_7a2;
      sStack_17b0 = sStack_17b0 - sStack_7a0;
      sStack_17ae = sStack_17ae - sStack_79e;
      sStack_17ac = sStack_17ac - sStack_79c;
      sStack_17aa = sStack_17aa - sStack_79a;
      uVar1 = local_1470[8];
      uVar2 = local_1470[9];
      local_7c8 = (short)uVar1;
      sStack_7c6 = (short)((ulong)uVar1 >> 0x10);
      sStack_7c4 = (short)((ulong)uVar1 >> 0x20);
      sStack_7c2 = (short)((ulong)uVar1 >> 0x30);
      sStack_7c0 = (short)uVar2;
      sStack_7be = (short)((ulong)uVar2 >> 0x10);
      sStack_7bc = (short)((ulong)uVar2 >> 0x20);
      sStack_7ba = (short)((ulong)uVar2 >> 0x30);
      local_6e8 = local_6e8 - local_7c8;
      sStack_6e6 = sStack_6e6 - sStack_7c6;
      sStack_6e4 = sStack_6e4 - sStack_7c4;
      sStack_6e2 = sStack_6e2 - sStack_7c2;
      sStack_16a0 = sStack_16b0 - sStack_7c0;
      sStack_169e = sStack_16ae - sStack_7be;
      sStack_169c = sStack_16ac - sStack_7bc;
      sStack_169a = sStack_16aa - sStack_7ba;
      local_17e8._0_4_ = CONCAT22(sStack_6e6,local_6e8);
      local_17e8._0_6_ = CONCAT24(sStack_6e4,(undefined4)local_17e8);
      local_17e8 = CONCAT26(sStack_6e2,(undefined6)local_17e8);
      uStack_17e0._0_4_ = CONCAT22(sStack_169e,sStack_16a0);
      uStack_17e0._0_6_ = CONCAT24(sStack_169c,(undefined4)uStack_17e0);
      uStack_17e0 = CONCAT26(sStack_169a,(undefined6)uStack_17e0);
      uVar1 = local_1470[0xc];
      uVar2 = local_1470[0xd];
      local_cb8 = CONCAT26(sStack_1732,CONCAT24(sStack_1734,CONCAT22(sStack_1736,local_1738)));
      uStack_cb0 = CONCAT26(sStack_172a,CONCAT24(sStack_172c,CONCAT22(sStack_172e,sStack_1730)));
      local_cc8 = uVar1;
      uStack_cc0 = uVar2;
      local_cc8._0_2_ = (short)uVar1;
      local_cc8._2_2_ = (short)((ulong)uVar1 >> 0x10);
      local_cc8._4_2_ = (short)((ulong)uVar1 >> 0x20);
      local_cc8._6_2_ = (short)((ulong)uVar1 >> 0x30);
      uStack_cc0._0_2_ = (short)uVar2;
      uStack_cc0._2_2_ = (short)((ulong)uVar2 >> 0x10);
      uStack_cc0._4_2_ = (short)((ulong)uVar2 >> 0x20);
      uStack_cc0._6_2_ = (short)((ulong)uVar2 >> 0x30);
      local_1738 = local_1738 + (short)local_cc8;
      sStack_1736 = sStack_1736 + local_cc8._2_2_;
      sStack_1734 = sStack_1734 + local_cc8._4_2_;
      sStack_1732 = sStack_1732 + local_cc8._6_2_;
      sStack_1730 = sStack_1730 + (short)uStack_cc0;
      sStack_172e = sStack_172e + uStack_cc0._2_2_;
      sStack_172c = sStack_172c + uStack_cc0._4_2_;
      sStack_172a = sStack_172a + uStack_cc0._6_2_;
      uVar1 = local_1470[2];
      uVar2 = local_1470[3];
      uVar3 = local_1470[4];
      uVar4 = local_1470[5];
      uVar5 = local_1470[6];
      uVar6 = local_1470[7];
      local_cd8 = uVar5;
      uStack_cd0 = uVar6;
      local_ce8 = uVar1;
      uStack_ce0 = uVar2;
      local_cd8._0_2_ = (short)uVar5;
      local_cd8._2_2_ = (short)((ulong)uVar5 >> 0x10);
      local_cd8._4_2_ = (short)((ulong)uVar5 >> 0x20);
      local_cd8._6_2_ = (short)((ulong)uVar5 >> 0x30);
      uStack_cd0._0_2_ = (short)uVar6;
      uStack_cd0._2_2_ = (short)((ulong)uVar6 >> 0x10);
      uStack_cd0._4_2_ = (short)((ulong)uVar6 >> 0x20);
      uStack_cd0._6_2_ = (short)((ulong)uVar6 >> 0x30);
      local_ce8._0_2_ = (short)uVar1;
      local_ce8._2_2_ = (short)((ulong)uVar1 >> 0x10);
      local_ce8._4_2_ = (short)((ulong)uVar1 >> 0x20);
      local_ce8._6_2_ = (short)((ulong)uVar1 >> 0x30);
      uStack_ce0._0_2_ = (short)uVar2;
      uStack_ce0._2_2_ = (short)((ulong)uVar2 >> 0x10);
      uStack_ce0._4_2_ = (short)((ulong)uVar2 >> 0x20);
      uStack_ce0._6_2_ = (short)((ulong)uVar2 >> 0x30);
      local_cf8 = uVar3;
      uStack_cf0 = uVar4;
      local_d08 = (short)local_cd8 + (short)local_ce8;
      sStack_d06 = local_cd8._2_2_ + local_ce8._2_2_;
      sStack_d04 = local_cd8._4_2_ + local_ce8._4_2_;
      sStack_d02 = local_cd8._6_2_ + local_ce8._6_2_;
      sStack_d00 = (short)uStack_cd0 + (short)uStack_ce0;
      sStack_cfe = uStack_cd0._2_2_ + uStack_ce0._2_2_;
      sStack_cfc = uStack_cd0._4_2_ + uStack_ce0._4_2_;
      sStack_cfa = uStack_cd0._6_2_ + uStack_ce0._6_2_;
      local_cf8._0_2_ = (short)uVar3;
      local_cf8._2_2_ = (short)((ulong)uVar3 >> 0x10);
      local_cf8._4_2_ = (short)((ulong)uVar3 >> 0x20);
      local_cf8._6_2_ = (short)((ulong)uVar3 >> 0x30);
      uStack_cf0._0_2_ = (short)uVar4;
      uStack_cf0._2_2_ = (short)((ulong)uVar4 >> 0x10);
      uStack_cf0._4_2_ = (short)((ulong)uVar4 >> 0x20);
      uStack_cf0._6_2_ = (short)((ulong)uVar4 >> 0x30);
      local_d28 = (short)local_cf8 + (short)local_cd8 + (short)local_ce8;
      sStack_d26 = local_cf8._2_2_ + local_cd8._2_2_ + local_ce8._2_2_;
      sStack_d24 = local_cf8._4_2_ + local_cd8._4_2_ + local_ce8._4_2_;
      sStack_d22 = local_cf8._6_2_ + local_cd8._6_2_ + local_ce8._6_2_;
      sStack_d20 = (short)uStack_cf0 + (short)uStack_cd0 + (short)uStack_ce0;
      sStack_d1e = uStack_cf0._2_2_ + uStack_cd0._2_2_ + uStack_ce0._2_2_;
      sStack_d1c = uStack_cf0._4_2_ + uStack_cd0._4_2_ + uStack_ce0._4_2_;
      sStack_d1a = uStack_cf0._6_2_ + uStack_cd0._6_2_ + uStack_ce0._6_2_;
      local_d18 = CONCAT26(sStack_1732,CONCAT24(sStack_1734,CONCAT22(sStack_1736,local_1738)));
      uStack_d10 = CONCAT26(sStack_172a,CONCAT24(sStack_172c,CONCAT22(sStack_172e,sStack_1730)));
      local_d28 = local_1738 + local_d28;
      sStack_d26 = sStack_1736 + sStack_d26;
      sStack_d24 = sStack_1734 + sStack_d24;
      sStack_d22 = sStack_1732 + sStack_d22;
      sStack_d20 = sStack_1730 + sStack_d20;
      sStack_d1e = sStack_172e + sStack_d1e;
      sStack_d1c = sStack_172c + sStack_d1c;
      sStack_d1a = sStack_172a + sStack_d1a;
      local_d38 = CONCAT26(sStack_17b2,CONCAT24(sStack_17b4,CONCAT22(sStack_17b6,local_17b8)));
      uStack_d30 = CONCAT26(sStack_17aa,CONCAT24(sStack_17ac,CONCAT22(sStack_17ae,sStack_17b0)));
      local_d48 = CONCAT26(sStack_d22,CONCAT24(sStack_d24,CONCAT22(sStack_d26,local_d28)));
      uStack_d40 = CONCAT26(sStack_d1a,CONCAT24(sStack_d1c,CONCAT22(sStack_d1e,sStack_d20)));
      local_1648 = local_17b8 + local_d28;
      uStack_1646 = sStack_17b6 + sStack_d26;
      uStack_1644 = sStack_17b4 + sStack_d24;
      uStack_1642 = sStack_17b2 + sStack_d22;
      sStack_1640 = sStack_17b0 + sStack_d20;
      sStack_163e = sStack_17ae + sStack_d1e;
      sStack_163c = sStack_17ac + sStack_d1c;
      sStack_163a = sStack_17aa + sStack_d1a;
      local_d58 = local_17e8;
      uStack_d50 = uStack_17e0;
      local_d68 = CONCAT26(sStack_d1a,CONCAT24(sStack_d1c,CONCAT22(sStack_d1e,sStack_d20)));
      uStack_d60 = 0;
      local_16a8 = local_6e8 + sStack_d20;
      uStack_16a6 = sStack_6e6 + sStack_d1e;
      uStack_16a4 = sStack_6e4 + sStack_d1c;
      uStack_16a2 = sStack_6e2 + sStack_d1a;
      local_1378 = CONCAT26(uStack_1642,CONCAT24(uStack_1644,CONCAT22(uStack_1646,local_1648)));
      uStack_1370 = CONCAT26(sStack_17aa + sStack_d1a,
                             CONCAT24(sStack_17ac + sStack_d1c,
                                      CONCAT22(sStack_17ae + sStack_d1e,sStack_17b0 + sStack_d20)));
      local_1388 = CONCAT26(uStack_16a2,CONCAT24(uStack_16a4,CONCAT22(uStack_16a6,local_16a8)));
      uStack_1380 = CONCAT26(sStack_169a,CONCAT24(sStack_169c,CONCAT22(sStack_169e,sStack_16a0)));
      local_1708 = local_1648 >> 4;
      uStack_1706 = uStack_1646 >> 4;
      uStack_1704 = uStack_1644 >> 4;
      uStack_1702 = uStack_1642 >> 4;
      uStack_1700 = local_16a8 >> 4;
      uStack_16fe = uStack_16a6 >> 4;
      uStack_16fc = uStack_16a4 >> 4;
      uStack_16fa = uStack_16a2 >> 4;
      uVar1 = local_1470[0xc];
      uVar2 = local_1470[0xd];
      local_d78 = CONCAT26(sStack_1732,CONCAT24(sStack_1734,CONCAT22(sStack_1736,local_1738)));
      uStack_d70 = CONCAT26(sStack_172a,CONCAT24(sStack_172c,CONCAT22(sStack_172e,sStack_1730)));
      local_d88 = uVar1;
      uStack_d80 = uVar2;
      local_d88._0_2_ = (short)uVar1;
      local_d88._2_2_ = (short)((ulong)uVar1 >> 0x10);
      local_d88._4_2_ = (short)((ulong)uVar1 >> 0x20);
      local_d88._6_2_ = (short)((ulong)uVar1 >> 0x30);
      uStack_d80._0_2_ = (short)uVar2;
      uStack_d80._2_2_ = (short)((ulong)uVar2 >> 0x10);
      uStack_d80._4_2_ = (short)((ulong)uVar2 >> 0x20);
      uStack_d80._6_2_ = (short)((ulong)uVar2 >> 0x30);
      local_1738 = local_1738 + (short)local_d88;
      sStack_1736 = sStack_1736 + local_d88._2_2_;
      sStack_1734 = sStack_1734 + local_d88._4_2_;
      sStack_1732 = sStack_1732 + local_d88._6_2_;
      sStack_1730 = sStack_1730 + (short)uStack_d80;
      sStack_172e = sStack_172e + uStack_d80._2_2_;
      sStack_172c = sStack_172c + uStack_d80._4_2_;
      sStack_172a = sStack_172a + uStack_d80._6_2_;
      uVar1 = local_1468[6];
      uVar2 = local_1468[7];
      local_7e8 = (short)uVar1;
      sStack_7e6 = (short)((ulong)uVar1 >> 0x10);
      sStack_7e4 = (short)((ulong)uVar1 >> 0x20);
      sStack_7e2 = (short)((ulong)uVar1 >> 0x30);
      sStack_7e0 = (short)uVar2;
      sStack_7de = (short)((ulong)uVar2 >> 0x10);
      sStack_7dc = (short)((ulong)uVar2 >> 0x20);
      sStack_7da = (short)((ulong)uVar2 >> 0x30);
      local_17b8 = local_17b8 - local_7e8;
      sStack_17b6 = sStack_17b6 - sStack_7e6;
      sStack_17b4 = sStack_17b4 - sStack_7e4;
      sStack_17b2 = sStack_17b2 - sStack_7e2;
      sStack_17b0 = sStack_17b0 - sStack_7e0;
      sStack_17ae = sStack_17ae - sStack_7de;
      sStack_17ac = sStack_17ac - sStack_7dc;
      sStack_17aa = sStack_17aa - sStack_7da;
      uVar1 = local_1470[6];
      uVar2 = local_1470[7];
      local_808 = (short)uVar1;
      sStack_806 = (short)((ulong)uVar1 >> 0x10);
      sStack_804 = (short)((ulong)uVar1 >> 0x20);
      sStack_802 = (short)((ulong)uVar1 >> 0x30);
      sStack_800 = (short)uVar2;
      sStack_7fe = (short)((ulong)uVar2 >> 0x10);
      sStack_7fc = (short)((ulong)uVar2 >> 0x20);
      sStack_7fa = (short)((ulong)uVar2 >> 0x30);
      local_6e8 = local_6e8 - local_808;
      sStack_6e6 = sStack_6e6 - sStack_806;
      sStack_6e4 = sStack_6e4 - sStack_804;
      sStack_6e2 = sStack_6e2 - sStack_802;
      sStack_1690 = sStack_16a0 - sStack_800;
      sStack_168e = sStack_169e - sStack_7fe;
      sStack_168c = sStack_169c - sStack_7fc;
      sStack_168a = sStack_169a - sStack_7fa;
      local_17e8._0_4_ = CONCAT22(sStack_6e6,local_6e8);
      local_17e8._0_6_ = CONCAT24(sStack_6e4,(undefined4)local_17e8);
      local_17e8 = CONCAT26(sStack_6e2,(undefined6)local_17e8);
      uStack_17e0._0_4_ = CONCAT22(sStack_168e,sStack_1690);
      uStack_17e0._0_6_ = CONCAT24(sStack_168c,(undefined4)uStack_17e0);
      uStack_17e0 = CONCAT26(sStack_168a,(undefined6)uStack_17e0);
      uVar1 = local_1470[4];
      uVar2 = local_1470[5];
      uVar3 = local_1470[6];
      uVar4 = local_1470[7];
      uVar5 = local_1470[8];
      uVar6 = local_1470[9];
      local_d98 = uVar5;
      uStack_d90 = uVar6;
      local_da8 = uVar1;
      uStack_da0 = uVar2;
      local_d98._0_2_ = (short)uVar5;
      local_d98._2_2_ = (short)((ulong)uVar5 >> 0x10);
      local_d98._4_2_ = (short)((ulong)uVar5 >> 0x20);
      local_d98._6_2_ = (short)((ulong)uVar5 >> 0x30);
      uStack_d90._0_2_ = (short)uVar6;
      uStack_d90._2_2_ = (short)((ulong)uVar6 >> 0x10);
      uStack_d90._4_2_ = (short)((ulong)uVar6 >> 0x20);
      uStack_d90._6_2_ = (short)((ulong)uVar6 >> 0x30);
      local_da8._0_2_ = (short)uVar1;
      local_da8._2_2_ = (short)((ulong)uVar1 >> 0x10);
      local_da8._4_2_ = (short)((ulong)uVar1 >> 0x20);
      local_da8._6_2_ = (short)((ulong)uVar1 >> 0x30);
      uStack_da0._0_2_ = (short)uVar2;
      uStack_da0._2_2_ = (short)((ulong)uVar2 >> 0x10);
      uStack_da0._4_2_ = (short)((ulong)uVar2 >> 0x20);
      uStack_da0._6_2_ = (short)((ulong)uVar2 >> 0x30);
      local_db8 = uVar3;
      uStack_db0 = uVar4;
      local_dc8 = (short)local_d98 + (short)local_da8;
      sStack_dc6 = local_d98._2_2_ + local_da8._2_2_;
      sStack_dc4 = local_d98._4_2_ + local_da8._4_2_;
      sStack_dc2 = local_d98._6_2_ + local_da8._6_2_;
      sStack_dc0 = (short)uStack_d90 + (short)uStack_da0;
      sStack_dbe = uStack_d90._2_2_ + uStack_da0._2_2_;
      sStack_dbc = uStack_d90._4_2_ + uStack_da0._4_2_;
      sStack_dba = uStack_d90._6_2_ + uStack_da0._6_2_;
      local_db8._0_2_ = (short)uVar3;
      local_db8._2_2_ = (short)((ulong)uVar3 >> 0x10);
      local_db8._4_2_ = (short)((ulong)uVar3 >> 0x20);
      local_db8._6_2_ = (short)((ulong)uVar3 >> 0x30);
      uStack_db0._0_2_ = (short)uVar4;
      uStack_db0._2_2_ = (short)((ulong)uVar4 >> 0x10);
      uStack_db0._4_2_ = (short)((ulong)uVar4 >> 0x20);
      uStack_db0._6_2_ = (short)((ulong)uVar4 >> 0x30);
      local_de8 = (short)local_db8 + (short)local_d98 + (short)local_da8;
      sStack_de6 = local_db8._2_2_ + local_d98._2_2_ + local_da8._2_2_;
      sStack_de4 = local_db8._4_2_ + local_d98._4_2_ + local_da8._4_2_;
      sStack_de2 = local_db8._6_2_ + local_d98._6_2_ + local_da8._6_2_;
      sStack_de0 = (short)uStack_db0 + (short)uStack_d90 + (short)uStack_da0;
      sStack_dde = uStack_db0._2_2_ + uStack_d90._2_2_ + uStack_da0._2_2_;
      sStack_ddc = uStack_db0._4_2_ + uStack_d90._4_2_ + uStack_da0._4_2_;
      sStack_dda = uStack_db0._6_2_ + uStack_d90._6_2_ + uStack_da0._6_2_;
      local_dd8 = CONCAT26(sStack_1732,CONCAT24(sStack_1734,CONCAT22(sStack_1736,local_1738)));
      uStack_dd0 = CONCAT26(sStack_172a,CONCAT24(sStack_172c,CONCAT22(sStack_172e,sStack_1730)));
      local_de8 = local_1738 + local_de8;
      sStack_de6 = sStack_1736 + sStack_de6;
      sStack_de4 = sStack_1734 + sStack_de4;
      sStack_de2 = sStack_1732 + sStack_de2;
      sStack_de0 = sStack_1730 + sStack_de0;
      sStack_dde = sStack_172e + sStack_dde;
      sStack_ddc = sStack_172c + sStack_ddc;
      sStack_dda = sStack_172a + sStack_dda;
      local_df8 = CONCAT26(sStack_17b2,CONCAT24(sStack_17b4,CONCAT22(sStack_17b6,local_17b8)));
      uStack_df0 = CONCAT26(sStack_17aa,CONCAT24(sStack_17ac,CONCAT22(sStack_17ae,sStack_17b0)));
      local_e08 = CONCAT26(sStack_de2,CONCAT24(sStack_de4,CONCAT22(sStack_de6,local_de8)));
      uStack_e00 = CONCAT26(sStack_dda,CONCAT24(sStack_ddc,CONCAT22(sStack_dde,sStack_de0)));
      local_1638 = local_17b8 + local_de8;
      uStack_1636 = sStack_17b6 + sStack_de6;
      uStack_1634 = sStack_17b4 + sStack_de4;
      uStack_1632 = sStack_17b2 + sStack_de2;
      sStack_1630 = sStack_17b0 + sStack_de0;
      sStack_162e = sStack_17ae + sStack_dde;
      sStack_162c = sStack_17ac + sStack_ddc;
      sStack_162a = sStack_17aa + sStack_dda;
      local_e18 = local_17e8;
      uStack_e10 = uStack_17e0;
      local_e28 = CONCAT26(sStack_dda,CONCAT24(sStack_ddc,CONCAT22(sStack_dde,sStack_de0)));
      uStack_e20 = 0;
      local_1698 = local_6e8 + sStack_de0;
      uStack_1696 = sStack_6e6 + sStack_dde;
      uStack_1694 = sStack_6e4 + sStack_ddc;
      uStack_1692 = sStack_6e2 + sStack_dda;
      local_1398 = CONCAT26(uStack_1632,CONCAT24(uStack_1634,CONCAT22(uStack_1636,local_1638)));
      uStack_1390 = CONCAT26(sStack_17aa + sStack_dda,
                             CONCAT24(sStack_17ac + sStack_ddc,
                                      CONCAT22(sStack_17ae + sStack_dde,sStack_17b0 + sStack_de0)));
      local_13a8 = CONCAT26(uStack_1692,CONCAT24(uStack_1694,CONCAT22(uStack_1696,local_1698)));
      uStack_13a0 = CONCAT26(sStack_168a,CONCAT24(sStack_168c,CONCAT22(sStack_168e,sStack_1690)));
      local_16f8 = local_1638 >> 4;
      uStack_16f6 = uStack_1636 >> 4;
      uStack_16f4 = uStack_1634 >> 4;
      uStack_16f2 = uStack_1632 >> 4;
      uStack_16f0 = local_1698 >> 4;
      uStack_16ee = uStack_1696 >> 4;
      uStack_16ec = uStack_1694 >> 4;
      uStack_16ea = uStack_1692 >> 4;
      uVar1 = local_1470[0xc];
      uVar2 = local_1470[0xd];
      local_e38 = CONCAT26(sStack_1732,CONCAT24(sStack_1734,CONCAT22(sStack_1736,local_1738)));
      uStack_e30 = CONCAT26(sStack_172a,CONCAT24(sStack_172c,CONCAT22(sStack_172e,sStack_1730)));
      local_e48 = uVar1;
      uStack_e40 = uVar2;
      local_e48._0_2_ = (short)uVar1;
      local_e48._2_2_ = (short)((ulong)uVar1 >> 0x10);
      local_e48._4_2_ = (short)((ulong)uVar1 >> 0x20);
      local_e48._6_2_ = (short)((ulong)uVar1 >> 0x30);
      uStack_e40._0_2_ = (short)uVar2;
      uStack_e40._2_2_ = (short)((ulong)uVar2 >> 0x10);
      uStack_e40._4_2_ = (short)((ulong)uVar2 >> 0x20);
      uStack_e40._6_2_ = (short)((ulong)uVar2 >> 0x30);
      local_1738 = local_1738 + (short)local_e48;
      sStack_1736 = sStack_1736 + local_e48._2_2_;
      sStack_1734 = sStack_1734 + local_e48._4_2_;
      sStack_1732 = sStack_1732 + local_e48._6_2_;
      sStack_1730 = sStack_1730 + (short)uStack_e40;
      sStack_172e = sStack_172e + uStack_e40._2_2_;
      sStack_172c = sStack_172c + uStack_e40._4_2_;
      sStack_172a = sStack_172a + uStack_e40._6_2_;
      uVar1 = local_1468[4];
      uVar2 = local_1468[5];
      local_828 = (short)uVar1;
      sStack_826 = (short)((ulong)uVar1 >> 0x10);
      sStack_824 = (short)((ulong)uVar1 >> 0x20);
      sStack_822 = (short)((ulong)uVar1 >> 0x30);
      sStack_820 = (short)uVar2;
      sStack_81e = (short)((ulong)uVar2 >> 0x10);
      sStack_81c = (short)((ulong)uVar2 >> 0x20);
      sStack_81a = (short)((ulong)uVar2 >> 0x30);
      local_17b8 = local_17b8 - local_828;
      sStack_17b6 = sStack_17b6 - sStack_826;
      sStack_17b4 = sStack_17b4 - sStack_824;
      sStack_17b2 = sStack_17b2 - sStack_822;
      sStack_17b0 = sStack_17b0 - sStack_820;
      sStack_17ae = sStack_17ae - sStack_81e;
      sStack_17ac = sStack_17ac - sStack_81c;
      sStack_17aa = sStack_17aa - sStack_81a;
      uVar1 = local_1470[4];
      uVar2 = local_1470[5];
      local_848 = (short)uVar1;
      sStack_846 = (short)((ulong)uVar1 >> 0x10);
      sStack_844 = (short)((ulong)uVar1 >> 0x20);
      sStack_842 = (short)((ulong)uVar1 >> 0x30);
      sStack_840 = (short)uVar2;
      sStack_83e = (short)((ulong)uVar2 >> 0x10);
      sStack_83c = (short)((ulong)uVar2 >> 0x20);
      sStack_83a = (short)((ulong)uVar2 >> 0x30);
      local_6e8 = local_6e8 - local_848;
      sStack_6e6 = sStack_6e6 - sStack_846;
      sStack_6e4 = sStack_6e4 - sStack_844;
      sStack_6e2 = sStack_6e2 - sStack_842;
      sStack_1680 = sStack_1690 - sStack_840;
      sStack_167e = sStack_168e - sStack_83e;
      sStack_167c = sStack_168c - sStack_83c;
      sStack_167a = sStack_168a - sStack_83a;
      local_17e8._0_4_ = CONCAT22(sStack_6e6,local_6e8);
      local_17e8._0_6_ = CONCAT24(sStack_6e4,(undefined4)local_17e8);
      local_17e8 = CONCAT26(sStack_6e2,(undefined6)local_17e8);
      uStack_17e0._0_4_ = CONCAT22(sStack_167e,sStack_1680);
      uStack_17e0._0_6_ = CONCAT24(sStack_167c,(undefined4)uStack_17e0);
      uStack_17e0 = CONCAT26(sStack_167a,(undefined6)uStack_17e0);
      uVar1 = local_1470[6];
      uVar2 = local_1470[7];
      uVar3 = local_1470[8];
      uVar4 = local_1470[9];
      uVar5 = local_1470[10];
      uVar6 = local_1470[0xb];
      local_e58 = uVar5;
      uStack_e50 = uVar6;
      local_e68 = uVar1;
      uStack_e60 = uVar2;
      local_e58._0_2_ = (short)uVar5;
      local_e58._2_2_ = (short)((ulong)uVar5 >> 0x10);
      local_e58._4_2_ = (short)((ulong)uVar5 >> 0x20);
      local_e58._6_2_ = (short)((ulong)uVar5 >> 0x30);
      uStack_e50._0_2_ = (short)uVar6;
      uStack_e50._2_2_ = (short)((ulong)uVar6 >> 0x10);
      uStack_e50._4_2_ = (short)((ulong)uVar6 >> 0x20);
      uStack_e50._6_2_ = (short)((ulong)uVar6 >> 0x30);
      local_e68._0_2_ = (short)uVar1;
      local_e68._2_2_ = (short)((ulong)uVar1 >> 0x10);
      local_e68._4_2_ = (short)((ulong)uVar1 >> 0x20);
      local_e68._6_2_ = (short)((ulong)uVar1 >> 0x30);
      uStack_e60._0_2_ = (short)uVar2;
      uStack_e60._2_2_ = (short)((ulong)uVar2 >> 0x10);
      uStack_e60._4_2_ = (short)((ulong)uVar2 >> 0x20);
      uStack_e60._6_2_ = (short)((ulong)uVar2 >> 0x30);
      local_e78 = uVar3;
      uStack_e70 = uVar4;
      local_e88 = (short)local_e58 + (short)local_e68;
      sStack_e86 = local_e58._2_2_ + local_e68._2_2_;
      sStack_e84 = local_e58._4_2_ + local_e68._4_2_;
      sStack_e82 = local_e58._6_2_ + local_e68._6_2_;
      sStack_e80 = (short)uStack_e50 + (short)uStack_e60;
      sStack_e7e = uStack_e50._2_2_ + uStack_e60._2_2_;
      sStack_e7c = uStack_e50._4_2_ + uStack_e60._4_2_;
      sStack_e7a = uStack_e50._6_2_ + uStack_e60._6_2_;
      local_e78._0_2_ = (short)uVar3;
      local_e78._2_2_ = (short)((ulong)uVar3 >> 0x10);
      local_e78._4_2_ = (short)((ulong)uVar3 >> 0x20);
      local_e78._6_2_ = (short)((ulong)uVar3 >> 0x30);
      uStack_e70._0_2_ = (short)uVar4;
      uStack_e70._2_2_ = (short)((ulong)uVar4 >> 0x10);
      uStack_e70._4_2_ = (short)((ulong)uVar4 >> 0x20);
      uStack_e70._6_2_ = (short)((ulong)uVar4 >> 0x30);
      local_ea8 = (short)local_e78 + (short)local_e58 + (short)local_e68;
      sStack_ea6 = local_e78._2_2_ + local_e58._2_2_ + local_e68._2_2_;
      sStack_ea4 = local_e78._4_2_ + local_e58._4_2_ + local_e68._4_2_;
      sStack_ea2 = local_e78._6_2_ + local_e58._6_2_ + local_e68._6_2_;
      sStack_ea0 = (short)uStack_e70 + (short)uStack_e50 + (short)uStack_e60;
      sStack_e9e = uStack_e70._2_2_ + uStack_e50._2_2_ + uStack_e60._2_2_;
      sStack_e9c = uStack_e70._4_2_ + uStack_e50._4_2_ + uStack_e60._4_2_;
      sStack_e9a = uStack_e70._6_2_ + uStack_e50._6_2_ + uStack_e60._6_2_;
      local_e98 = CONCAT26(sStack_1732,CONCAT24(sStack_1734,CONCAT22(sStack_1736,local_1738)));
      uStack_e90 = CONCAT26(sStack_172a,CONCAT24(sStack_172c,CONCAT22(sStack_172e,sStack_1730)));
      local_ea8 = local_1738 + local_ea8;
      sStack_ea6 = sStack_1736 + sStack_ea6;
      sStack_ea4 = sStack_1734 + sStack_ea4;
      sStack_ea2 = sStack_1732 + sStack_ea2;
      sStack_ea0 = sStack_1730 + sStack_ea0;
      sStack_e9e = sStack_172e + sStack_e9e;
      sStack_e9c = sStack_172c + sStack_e9c;
      sStack_e9a = sStack_172a + sStack_e9a;
      local_eb8 = CONCAT26(sStack_17b2,CONCAT24(sStack_17b4,CONCAT22(sStack_17b6,local_17b8)));
      uStack_eb0 = CONCAT26(sStack_17aa,CONCAT24(sStack_17ac,CONCAT22(sStack_17ae,sStack_17b0)));
      local_ec8 = CONCAT26(sStack_ea2,CONCAT24(sStack_ea4,CONCAT22(sStack_ea6,local_ea8)));
      uStack_ec0 = CONCAT26(sStack_e9a,CONCAT24(sStack_e9c,CONCAT22(sStack_e9e,sStack_ea0)));
      local_1628 = local_17b8 + local_ea8;
      uStack_1626 = sStack_17b6 + sStack_ea6;
      uStack_1624 = sStack_17b4 + sStack_ea4;
      uStack_1622 = sStack_17b2 + sStack_ea2;
      sStack_1620 = sStack_17b0 + sStack_ea0;
      sStack_161e = sStack_17ae + sStack_e9e;
      sStack_161c = sStack_17ac + sStack_e9c;
      sStack_161a = sStack_17aa + sStack_e9a;
      local_ed8 = local_17e8;
      uStack_ed0 = uStack_17e0;
      local_ee8 = CONCAT26(sStack_e9a,CONCAT24(sStack_e9c,CONCAT22(sStack_e9e,sStack_ea0)));
      uStack_ee0 = 0;
      local_1688 = local_6e8 + sStack_ea0;
      uStack_1686 = sStack_6e6 + sStack_e9e;
      uStack_1684 = sStack_6e4 + sStack_e9c;
      uStack_1682 = sStack_6e2 + sStack_e9a;
      local_13b8 = CONCAT26(uStack_1622,CONCAT24(uStack_1624,CONCAT22(uStack_1626,local_1628)));
      uStack_13b0 = CONCAT26(sStack_17aa + sStack_e9a,
                             CONCAT24(sStack_17ac + sStack_e9c,
                                      CONCAT22(sStack_17ae + sStack_e9e,sStack_17b0 + sStack_ea0)));
      local_13c8 = CONCAT26(uStack_1682,CONCAT24(uStack_1684,CONCAT22(uStack_1686,local_1688)));
      uStack_13c0 = CONCAT26(sStack_167a,CONCAT24(sStack_167c,CONCAT22(sStack_167e,sStack_1680)));
      local_16e8 = local_1628 >> 4;
      uStack_16e6 = uStack_1626 >> 4;
      uStack_16e4 = uStack_1624 >> 4;
      uStack_16e2 = uStack_1622 >> 4;
      uStack_16e0 = local_1688 >> 4;
      uStack_16de = uStack_1686 >> 4;
      uStack_16dc = uStack_1684 >> 4;
      uStack_16da = uStack_1682 >> 4;
      uVar1 = local_1470[0xc];
      uVar2 = local_1470[0xd];
      local_ef8 = CONCAT26(sStack_1732,CONCAT24(sStack_1734,CONCAT22(sStack_1736,local_1738)));
      uStack_ef0 = CONCAT26(sStack_172a,CONCAT24(sStack_172c,CONCAT22(sStack_172e,sStack_1730)));
      local_f08 = uVar1;
      uStack_f00 = uVar2;
      local_f08._0_2_ = (short)uVar1;
      local_f08._2_2_ = (short)((ulong)uVar1 >> 0x10);
      local_f08._4_2_ = (short)((ulong)uVar1 >> 0x20);
      local_f08._6_2_ = (short)((ulong)uVar1 >> 0x30);
      uStack_f00._0_2_ = (short)uVar2;
      uStack_f00._2_2_ = (short)((ulong)uVar2 >> 0x10);
      uStack_f00._4_2_ = (short)((ulong)uVar2 >> 0x20);
      uStack_f00._6_2_ = (short)((ulong)uVar2 >> 0x30);
      local_1738 = local_1738 + (short)local_f08;
      sStack_1736 = sStack_1736 + local_f08._2_2_;
      sStack_1734 = sStack_1734 + local_f08._4_2_;
      sStack_1732 = sStack_1732 + local_f08._6_2_;
      sStack_1730 = sStack_1730 + (short)uStack_f00;
      sStack_172e = sStack_172e + uStack_f00._2_2_;
      sStack_172c = sStack_172c + uStack_f00._4_2_;
      sStack_172a = sStack_172a + uStack_f00._6_2_;
      uVar1 = local_1468[2];
      uVar2 = local_1468[3];
      local_868 = (short)uVar1;
      sStack_866 = (short)((ulong)uVar1 >> 0x10);
      sStack_864 = (short)((ulong)uVar1 >> 0x20);
      sStack_862 = (short)((ulong)uVar1 >> 0x30);
      sStack_860 = (short)uVar2;
      sStack_85e = (short)((ulong)uVar2 >> 0x10);
      sStack_85c = (short)((ulong)uVar2 >> 0x20);
      sStack_85a = (short)((ulong)uVar2 >> 0x30);
      local_17b8 = local_17b8 - local_868;
      sStack_17b6 = sStack_17b6 - sStack_866;
      sStack_17b4 = sStack_17b4 - sStack_864;
      sStack_17b2 = sStack_17b2 - sStack_862;
      sStack_17b0 = sStack_17b0 - sStack_860;
      sStack_17ae = sStack_17ae - sStack_85e;
      sStack_17ac = sStack_17ac - sStack_85c;
      sStack_17aa = sStack_17aa - sStack_85a;
      uVar1 = local_1470[2];
      uVar2 = local_1470[3];
      local_888 = (short)uVar1;
      sStack_886 = (short)((ulong)uVar1 >> 0x10);
      sStack_884 = (short)((ulong)uVar1 >> 0x20);
      sStack_882 = (short)((ulong)uVar1 >> 0x30);
      sStack_880 = (short)uVar2;
      sStack_87e = (short)((ulong)uVar2 >> 0x10);
      sStack_87c = (short)((ulong)uVar2 >> 0x20);
      sStack_87a = (short)((ulong)uVar2 >> 0x30);
      sStack_1670 = sStack_1680 - sStack_880;
      sStack_166e = sStack_167e - sStack_87e;
      sStack_166c = sStack_167c - sStack_87c;
      sStack_166a = sStack_167a - sStack_87a;
      local_17e8._0_4_ = CONCAT22(sStack_6e6 - sStack_886,local_6e8 - local_888);
      local_17e8._0_6_ = CONCAT24(sStack_6e4 - sStack_884,(undefined4)local_17e8);
      local_17e8 = CONCAT26(sStack_6e2 - sStack_882,(undefined6)local_17e8);
      uStack_17e0._0_4_ = CONCAT22(sStack_166e,sStack_1670);
      uStack_17e0._0_6_ = CONCAT24(sStack_166c,(undefined4)uStack_17e0);
      uStack_17e0 = CONCAT26(sStack_166a,(undefined6)uStack_17e0);
      uVar1 = local_1470[8];
      uVar2 = local_1470[9];
      uVar3 = local_1470[10];
      uVar4 = local_1470[0xb];
      uVar5 = local_1470[0xc];
      uVar6 = local_1470[0xd];
      local_f18 = uVar5;
      uStack_f10 = uVar6;
      local_f28 = uVar1;
      uStack_f20 = uVar2;
      local_f18._0_2_ = (short)uVar5;
      local_f18._2_2_ = (short)((ulong)uVar5 >> 0x10);
      local_f18._4_2_ = (short)((ulong)uVar5 >> 0x20);
      local_f18._6_2_ = (short)((ulong)uVar5 >> 0x30);
      uStack_f10._0_2_ = (short)uVar6;
      uStack_f10._2_2_ = (short)((ulong)uVar6 >> 0x10);
      uStack_f10._4_2_ = (short)((ulong)uVar6 >> 0x20);
      uStack_f10._6_2_ = (short)((ulong)uVar6 >> 0x30);
      local_f28._0_2_ = (short)uVar1;
      local_f28._2_2_ = (short)((ulong)uVar1 >> 0x10);
      local_f28._4_2_ = (short)((ulong)uVar1 >> 0x20);
      local_f28._6_2_ = (short)((ulong)uVar1 >> 0x30);
      uStack_f20._0_2_ = (short)uVar2;
      uStack_f20._2_2_ = (short)((ulong)uVar2 >> 0x10);
      uStack_f20._4_2_ = (short)((ulong)uVar2 >> 0x20);
      uStack_f20._6_2_ = (short)((ulong)uVar2 >> 0x30);
      local_f38 = uVar3;
      uStack_f30 = uVar4;
      local_f48 = (short)local_f18 + (short)local_f28;
      sStack_f46 = local_f18._2_2_ + local_f28._2_2_;
      sStack_f44 = local_f18._4_2_ + local_f28._4_2_;
      sStack_f42 = local_f18._6_2_ + local_f28._6_2_;
      sStack_f40 = (short)uStack_f10 + (short)uStack_f20;
      sStack_f3e = uStack_f10._2_2_ + uStack_f20._2_2_;
      sStack_f3c = uStack_f10._4_2_ + uStack_f20._4_2_;
      sStack_f3a = uStack_f10._6_2_ + uStack_f20._6_2_;
      local_f38._0_2_ = (short)uVar3;
      local_f38._2_2_ = (short)((ulong)uVar3 >> 0x10);
      local_f38._4_2_ = (short)((ulong)uVar3 >> 0x20);
      local_f38._6_2_ = (short)((ulong)uVar3 >> 0x30);
      uStack_f30._0_2_ = (short)uVar4;
      uStack_f30._2_2_ = (short)((ulong)uVar4 >> 0x10);
      uStack_f30._4_2_ = (short)((ulong)uVar4 >> 0x20);
      uStack_f30._6_2_ = (short)((ulong)uVar4 >> 0x30);
      local_f68 = (short)local_f38 + (short)local_f18 + (short)local_f28;
      sStack_f66 = local_f38._2_2_ + local_f18._2_2_ + local_f28._2_2_;
      sStack_f64 = local_f38._4_2_ + local_f18._4_2_ + local_f28._4_2_;
      sStack_f62 = local_f38._6_2_ + local_f18._6_2_ + local_f28._6_2_;
      sStack_f60 = (short)uStack_f30 + (short)uStack_f10 + (short)uStack_f20;
      sStack_f5e = uStack_f30._2_2_ + uStack_f10._2_2_ + uStack_f20._2_2_;
      sStack_f5c = uStack_f30._4_2_ + uStack_f10._4_2_ + uStack_f20._4_2_;
      sStack_f5a = uStack_f30._6_2_ + uStack_f10._6_2_ + uStack_f20._6_2_;
      local_f58 = CONCAT26(sStack_1732,CONCAT24(sStack_1734,CONCAT22(sStack_1736,local_1738)));
      uStack_f50 = CONCAT26(sStack_172a,CONCAT24(sStack_172c,CONCAT22(sStack_172e,sStack_1730)));
      local_1778 = local_1738 + local_f68;
      sStack_1776 = sStack_1736 + sStack_f66;
      sStack_1774 = sStack_1734 + sStack_f64;
      sStack_1772 = sStack_1732 + sStack_f62;
      sStack_1770 = sStack_1730 + sStack_f60;
      sStack_176e = sStack_172e + sStack_f5e;
      sStack_176c = sStack_172c + sStack_f5c;
      sStack_176a = sStack_172a + sStack_f5a;
      local_f78 = CONCAT26(sStack_17b2,CONCAT24(sStack_17b4,CONCAT22(sStack_17b6,local_17b8)));
      uStack_f70 = CONCAT26(sStack_17aa,CONCAT24(sStack_17ac,CONCAT22(sStack_17ae,sStack_17b0)));
      local_f88 = CONCAT26(sStack_1772,CONCAT24(sStack_1774,CONCAT22(sStack_1776,local_1778)));
      uStack_f80 = CONCAT26(sStack_176a,CONCAT24(sStack_176c,CONCAT22(sStack_176e,sStack_1770)));
      local_1618 = local_17b8 + local_1778;
      uStack_1616 = sStack_17b6 + sStack_1776;
      uStack_1614 = sStack_17b4 + sStack_1774;
      uStack_1612 = sStack_17b2 + sStack_1772;
      sStack_1610 = sStack_17b0 + sStack_1770;
      sStack_160e = sStack_17ae + sStack_176e;
      sStack_160c = sStack_17ac + sStack_176c;
      sStack_160a = sStack_17aa + sStack_176a;
      local_f98 = local_17e8;
      uStack_f90 = uStack_17e0;
      local_fa8 = CONCAT26(sStack_176a,CONCAT24(sStack_176c,CONCAT22(sStack_176e,sStack_1770)));
      uStack_fa0 = 0;
      local_1678 = (local_6e8 - local_888) + sStack_1770;
      uStack_1676 = (sStack_6e6 - sStack_886) + sStack_176e;
      uStack_1674 = (sStack_6e4 - sStack_884) + sStack_176c;
      uStack_1672 = (sStack_6e2 - sStack_882) + sStack_176a;
      local_13d8 = CONCAT26(uStack_1612,CONCAT24(uStack_1614,CONCAT22(uStack_1616,local_1618)));
      uStack_13d0 = CONCAT26(sStack_17aa + sStack_176a,
                             CONCAT24(sStack_17ac + sStack_176c,
                                      CONCAT22(sStack_17ae + sStack_176e,sStack_17b0 + sStack_1770))
                            );
      local_13e8 = CONCAT26(uStack_1672,CONCAT24(uStack_1674,CONCAT22(uStack_1676,local_1678)));
      uStack_13e0 = CONCAT26(sStack_166a,CONCAT24(sStack_166c,CONCAT22(sStack_166e,sStack_1670)));
      local_16d8 = local_1618 >> 4;
      uStack_16d6 = uStack_1616 >> 4;
      uStack_16d4 = uStack_1614 >> 4;
      uStack_16d2 = uStack_1612 >> 4;
      uStack_16d0 = local_1678 >> 4;
      uStack_16ce = uStack_1676 >> 4;
      uStack_16cc = uStack_1674 >> 4;
      uStack_16ca = uStack_1672 >> 4;
    }
    local_1328 = local_1558;
    *local_1470 = CONCAT44(uStack_1544,local_1548);
    puVar39[1] = local_1558;
    puVar39 = local_1470;
    *(undefined4 *)(local_1470 + 3) = uStack_570;
    *(undefined4 *)((long)puVar39 + 0x1c) = uStack_153c;
    *(undefined4 *)(puVar39 + 4) = uStack_580;
    *(undefined4 *)((long)puVar39 + 0x24) = uStack_154c;
    for (local_1490 = 0; local_1490 < 3; local_1490 = local_1490 + 1) {
      uVar1 = local_1470[(long)local_1490 * 2];
      uVar2 = (local_1470 + (long)local_1490 * 2)[1];
      local_518 = (uint)local_1568;
      uStack_514 = (uint)(local_1568 >> 0x20);
      uStack_510 = (uint)uStack_1560;
      uStack_50c = (uint)(uStack_1560 >> 0x20);
      local_528 = (uint)uVar1;
      uStack_524 = (uint)((ulong)uVar1 >> 0x20);
      uStack_520 = (uint)uVar2;
      uStack_51c = (uint)((ulong)uVar2 >> 0x20);
      puVar41 = (uint *)(local_1470 + (long)local_1490 * 2);
      *puVar41 = (local_518 ^ 0xffffffff) & local_528;
      puVar41[1] = (uStack_514 ^ 0xffffffff) & uStack_524;
      puVar41[2] = (uStack_510 ^ 0xffffffff) & uStack_520;
      puVar41[3] = (uStack_50c ^ 0xffffffff) & uStack_51c;
      uStack_1090 = (&uStack_1600)[(long)local_1490 * 2];
      local_1088 = local_1568;
      uStack_1080 = uStack_1560;
      local_1098 = (&local_1608)[(long)local_1490 * 2];
      (&local_1608)[(long)local_1490 * 2] = local_1568 & (&local_1608)[(long)local_1490 * 2];
      (&uStack_1600)[(long)local_1490 * 2] = uStack_1560 & uStack_1090;
      uVar25 = (local_1470 + (long)local_1490 * 2)[1];
      uVar26 = (&uStack_1600)[(long)local_1490 * 2];
      local_1470[(long)local_1490 * 2] =
           local_1470[(long)local_1490 * 2] | (&local_1608)[(long)local_1490 * 2];
      (local_1470 + (long)local_1490 * 2)[1] = uVar25 | uVar26;
    }
    if (local_17ec != 0) {
      for (local_1490 = 0; local_1490 < 6; local_1490 = local_1490 + 1) {
        uVar1 = local_1470[(long)local_1490 * 2];
        uVar2 = (local_1470 + (long)local_1490 * 2)[1];
        local_4f8 = (uint)local_1578;
        uStack_4f4 = (uint)(local_1578 >> 0x20);
        uStack_4f0 = (uint)uStack_1570;
        uStack_4ec = (uint)(uStack_1570 >> 0x20);
        local_508 = (uint)uVar1;
        uStack_504 = (uint)((ulong)uVar1 >> 0x20);
        uStack_500 = (uint)uVar2;
        uStack_4fc = (uint)((ulong)uVar2 >> 0x20);
        puVar41 = (uint *)(local_1470 + (long)local_1490 * 2);
        *puVar41 = (local_4f8 ^ 0xffffffff) & local_508;
        puVar41[1] = (uStack_4f4 ^ 0xffffffff) & uStack_504;
        puVar41[2] = (uStack_4f0 ^ 0xffffffff) & uStack_500;
        puVar41[3] = (uStack_4ec ^ 0xffffffff) & uStack_4fc;
        uStack_1070 = (&uStack_1720)[(long)local_1490 * 2];
        local_1068 = local_1578;
        uStack_1060 = uStack_1570;
        local_1078 = (&local_1728)[(long)local_1490 * 2];
        (&local_1728)[(long)local_1490 * 2] = local_1578 & (&local_1728)[(long)local_1490 * 2];
        (&uStack_1720)[(long)local_1490 * 2] = uStack_1570 & uStack_1070;
        uVar25 = (local_1470 + (long)local_1490 * 2)[1];
        uVar26 = (&uStack_1720)[(long)local_1490 * 2];
        local_1470[(long)local_1490 * 2] =
             local_1470[(long)local_1490 * 2] | (&local_1728)[(long)local_1490 * 2];
        (local_1470 + (long)local_1490 * 2)[1] = uVar25 | uVar26;
      }
    }
  }
  for (iVar49 = 0; iVar49 < 6; iVar49 = iVar49 + 1) {
    local_1420 = (undefined8 *)(local_1830 + (long)((iVar49 + 1) * local_1834) * -2);
    local_1438 = auStack_19a0[(long)iVar49 * 2 + -1];
    uStack_1430 = auStack_19a0[(long)iVar49 * 2];
    *local_1420 = auStack_19a0[(long)iVar49 * 2 + -1];
    local_1440 = (undefined8 *)(local_1830 + (long)(iVar49 * local_1834) * 2);
    local_1458 = auStack_19a0[(long)iVar49 * 2];
    uStack_1450 = 0;
    *local_1440 = auStack_19a0[(long)iVar49 * 2];
  }
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_14_sse2(uint16_t *s, int pitch,
                                       const uint8_t *blimit,
                                       const uint8_t *limit,
                                       const uint8_t *thresh, int bd) {
  __m128i p[7], q[7], pq[7];
  int i;

  for (i = 0; i < 7; i++) {
    p[i] = _mm_loadl_epi64((__m128i *)(s - (i + 1) * pitch));
    q[i] = _mm_loadl_epi64((__m128i *)(s + i * pitch));
  }

  highbd_lpf_internal_14_sse2(p, q, pq, blimit, limit, thresh, bd);

  for (i = 0; i < 6; i++) {
    _mm_storel_epi64((__m128i *)(s - (i + 1) * pitch), pq[i]);
    _mm_storel_epi64((__m128i *)(s + i * pitch), _mm_srli_si128(pq[i], 8));
  }
}